

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  byte bVar97;
  uint uVar98;
  ulong uVar99;
  ulong uVar100;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar101;
  uint uVar102;
  long lVar103;
  ulong uVar104;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  long lVar105;
  byte bVar106;
  bool bVar107;
  float fVar108;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined4 uVar109;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar148;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar121 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar152 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar170;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar188;
  float fVar189;
  undefined1 auVar181 [32];
  float fVar190;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar211 [16];
  float fVar210;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar227;
  float fVar228;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar229;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar230;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [28];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [28];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar265;
  undefined1 auVar266 [16];
  float fVar271;
  undefined1 auVar267 [32];
  float fVar269;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar268 [64];
  float fVar280;
  undefined1 auVar277 [32];
  undefined1 auVar275 [16];
  undefined1 auVar278 [32];
  undefined1 auVar276 [16];
  undefined1 auVar279 [64];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [64];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [64];
  float fVar289;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  float fVar293;
  float fVar294;
  undefined1 auVar292 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar298;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar299 [16];
  float fVar305;
  float fVar306;
  float fVar307;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b44;
  int local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [16];
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined8 local_9e0;
  undefined4 local_9d8;
  float local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  uint local_9c8;
  uint local_9c4;
  uint local_9c0;
  ulong local_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  float local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  ulong local_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar6 = prim[1];
  uVar99 = (ulong)(byte)PVar6;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *(ulong *)(prim + uVar99 * 4 + 6);
  local_880 = vpmovsxbd_avx2(auVar257);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar99 * 5 + 6);
  auVar124 = vpmovsxbd_avx2(auVar113);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + uVar99 * 6 + 6);
  auVar168 = vpmovsxbd_avx2(auVar290);
  lVar103 = uVar99 * 0x25;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = *(ulong *)(prim + uVar99 * 0xf + 6);
  auVar162 = vpmovsxbd_avx2(auVar299);
  auVar159._1_3_ = 0;
  auVar159[0] = PVar6;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar12 = vpmovsxbd_avx2(auVar291);
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *(ulong *)(prim + uVar99 * 0x11 + 6);
  auVar128 = vpmovsxbd_avx2(auVar240);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar99 * 0x1a + 6);
  auVar13 = vpmovsxbd_avx2(auVar4);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar99 * 0x1b + 6);
  auVar14 = vpmovsxbd_avx2(auVar175);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar99 * 0x1c + 6);
  auVar15 = vpmovsxbd_avx2(auVar5);
  auVar257 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar103 + 6));
  fVar227 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar103 + 0x16)) *
            *(float *)(prim + lVar103 + 0x1a);
  fVar210 = *(float *)(prim + lVar103 + 0x12);
  auVar281._0_4_ = fVar210 * (ray->dir).field_0.m128[0];
  auVar281._4_4_ = fVar210 * (ray->dir).field_0.m128[1];
  auVar281._8_4_ = fVar210 * (ray->dir).field_0.m128[2];
  auVar281._12_4_ = fVar210 * (ray->dir).field_0.m128[3];
  auVar256._0_4_ = fVar210 * auVar257._0_4_;
  auVar256._4_4_ = fVar210 * auVar257._4_4_;
  auVar256._8_4_ = fVar210 * auVar257._8_4_;
  auVar256._12_4_ = fVar210 * auVar257._12_4_;
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar249 = vcvtdq2ps_avx(auVar14);
  auVar137 = vcvtdq2ps_avx(auVar15);
  auVar257 = vmovshdup_avx(auVar281);
  auVar220._0_8_ = auVar257._0_8_;
  auVar220._8_8_ = auVar220._0_8_;
  auVar220._16_8_ = auVar220._0_8_;
  auVar220._24_8_ = auVar220._0_8_;
  auVar257 = vshufps_avx(auVar281,auVar281,0xaa);
  fVar210 = auVar257._0_4_;
  fVar228 = auVar257._4_4_;
  auVar126._4_4_ = fVar228 * auVar168._4_4_;
  auVar126._0_4_ = fVar210 * auVar168._0_4_;
  auVar126._8_4_ = fVar210 * auVar168._8_4_;
  auVar126._12_4_ = fVar228 * auVar168._12_4_;
  auVar126._16_4_ = fVar210 * auVar168._16_4_;
  auVar126._20_4_ = fVar228 * auVar168._20_4_;
  auVar126._24_4_ = fVar210 * auVar168._24_4_;
  auVar126._28_4_ = auVar15._28_4_;
  auVar15._4_4_ = fVar228 * auVar128._4_4_;
  auVar15._0_4_ = fVar210 * auVar128._0_4_;
  auVar15._8_4_ = fVar210 * auVar128._8_4_;
  auVar15._12_4_ = fVar228 * auVar128._12_4_;
  auVar15._16_4_ = fVar210 * auVar128._16_4_;
  auVar15._20_4_ = fVar228 * auVar128._20_4_;
  auVar15._24_4_ = fVar210 * auVar128._24_4_;
  auVar15._28_4_ = auVar14._28_4_;
  auVar14._4_4_ = auVar137._4_4_ * fVar228;
  auVar14._0_4_ = auVar137._0_4_ * fVar210;
  auVar14._8_4_ = auVar137._8_4_ * fVar210;
  auVar14._12_4_ = auVar137._12_4_ * fVar228;
  auVar14._16_4_ = auVar137._16_4_ * fVar210;
  auVar14._20_4_ = auVar137._20_4_ * fVar228;
  auVar14._24_4_ = auVar137._24_4_ * fVar210;
  auVar14._28_4_ = fVar228;
  auVar113 = vfmadd231ps_fma(auVar126,auVar220,auVar124);
  auVar290 = vfmadd231ps_fma(auVar15,auVar220,auVar12);
  auVar299 = vfmadd231ps_fma(auVar14,auVar249,auVar220);
  auVar257 = vshufps_avx(auVar256,auVar256,0xaa);
  fVar210 = auVar257._0_4_;
  auVar221._0_4_ = fVar210 * auVar168._0_4_;
  fVar228 = auVar257._4_4_;
  auVar221._4_4_ = fVar228 * auVar168._4_4_;
  auVar221._8_4_ = fVar210 * auVar168._8_4_;
  auVar221._12_4_ = fVar228 * auVar168._12_4_;
  auVar221._16_4_ = fVar210 * auVar168._16_4_;
  auVar221._20_4_ = fVar228 * auVar168._20_4_;
  auVar221._24_4_ = fVar210 * auVar168._24_4_;
  auVar221._28_4_ = 0;
  auVar168._4_4_ = fVar228 * auVar128._4_4_;
  auVar168._0_4_ = fVar210 * auVar128._0_4_;
  auVar168._8_4_ = fVar210 * auVar128._8_4_;
  auVar168._12_4_ = fVar228 * auVar128._12_4_;
  auVar168._16_4_ = fVar210 * auVar128._16_4_;
  auVar168._20_4_ = fVar228 * auVar128._20_4_;
  auVar168._24_4_ = fVar210 * auVar128._24_4_;
  auVar168._28_4_ = auVar128._28_4_;
  auVar128._4_4_ = auVar137._4_4_ * fVar228;
  auVar128._0_4_ = auVar137._0_4_ * fVar210;
  auVar128._8_4_ = auVar137._8_4_ * fVar210;
  auVar128._12_4_ = auVar137._12_4_ * fVar228;
  auVar128._16_4_ = auVar137._16_4_ * fVar210;
  auVar128._20_4_ = auVar137._20_4_ * fVar228;
  auVar128._24_4_ = auVar137._24_4_ * fVar210;
  auVar128._28_4_ = auVar137._28_4_;
  auVar257 = vmovshdup_avx(auVar256);
  auVar122._0_8_ = auVar257._0_8_;
  auVar122._8_8_ = auVar122._0_8_;
  auVar122._16_8_ = auVar122._0_8_;
  auVar122._24_8_ = auVar122._0_8_;
  auVar257 = vfmadd231ps_fma(auVar221,auVar122,auVar124);
  local_8a0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 7 + 6));
  auVar291 = vfmadd231ps_fma(auVar168,auVar122,auVar12);
  auVar137 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0xb + 6));
  auVar240 = vfmadd231ps_fma(auVar128,auVar122,auVar249);
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 9 + 6));
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0xd + 6));
  auVar124 = vcvtdq2ps_avx(local_880);
  auVar168 = vcvtdq2ps_avx(auVar162);
  auVar12 = vcvtdq2ps_avx(auVar13);
  auVar282._4_4_ = auVar281._0_4_;
  auVar282._0_4_ = auVar281._0_4_;
  auVar282._8_4_ = auVar281._0_4_;
  auVar282._12_4_ = auVar281._0_4_;
  auVar282._16_4_ = auVar281._0_4_;
  auVar282._20_4_ = auVar281._0_4_;
  auVar282._24_4_ = auVar281._0_4_;
  auVar282._28_4_ = auVar281._0_4_;
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar282,auVar124);
  auVar290 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar282,auVar168);
  auVar299 = vfmadd231ps_fma(ZEXT1632(auVar299),auVar12,auVar282);
  auVar162 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x12 + 6));
  auVar260._4_4_ = auVar256._0_4_;
  auVar260._0_4_ = auVar256._0_4_;
  auVar260._8_4_ = auVar256._0_4_;
  auVar260._12_4_ = auVar256._0_4_;
  auVar260._16_4_ = auVar256._0_4_;
  auVar260._20_4_ = auVar256._0_4_;
  auVar260._24_4_ = auVar256._0_4_;
  auVar260._28_4_ = auVar256._0_4_;
  auVar256 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar260,auVar124);
  auVar281 = vfmadd231ps_fma(ZEXT1632(auVar291),auVar260,auVar168);
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar240),auVar260,auVar12);
  local_740._8_4_ = 0x7fffffff;
  local_740._0_8_ = 0x7fffffff7fffffff;
  local_740._12_4_ = 0x7fffffff;
  local_740._16_4_ = 0x7fffffff;
  local_740._20_4_ = 0x7fffffff;
  local_740._24_4_ = 0x7fffffff;
  local_740._28_4_ = 0x7fffffff;
  auVar124 = vandps_avx(ZEXT1632(auVar113),local_740);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar157._16_4_ = 0x219392ef;
  auVar157._20_4_ = 0x219392ef;
  auVar157._24_4_ = 0x219392ef;
  auVar157._28_4_ = 0x219392ef;
  auVar124 = vcmpps_avx(auVar124,auVar157,1);
  auVar168 = vblendvps_avx(ZEXT1632(auVar113),auVar157,auVar124);
  auVar124 = vandps_avx(ZEXT1632(auVar290),local_740);
  auVar124 = vcmpps_avx(auVar124,auVar157,1);
  auVar12 = vblendvps_avx(ZEXT1632(auVar290),auVar157,auVar124);
  auVar124 = vandps_avx(local_740,ZEXT1632(auVar299));
  auVar124 = vcmpps_avx(auVar124,auVar157,1);
  auVar124 = vblendvps_avx(ZEXT1632(auVar299),auVar157,auVar124);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x16 + 6));
  auVar126 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x14 + 6));
  auVar247._4_4_ = fVar227;
  auVar247._0_4_ = fVar227;
  auVar247._8_4_ = fVar227;
  auVar247._12_4_ = fVar227;
  auVar247._16_4_ = fVar227;
  auVar247._20_4_ = fVar227;
  auVar247._24_4_ = fVar227;
  auVar247._28_4_ = fVar227;
  auVar128 = vcvtdq2ps_avx(local_8a0);
  auVar249 = vcvtdq2ps_avx(auVar137);
  auVar249 = vsubps_avx(auVar249,auVar128);
  auVar299 = vfmadd213ps_fma(auVar249,auVar247,auVar128);
  auVar128 = vcvtdq2ps_avx(auVar14);
  auVar249 = vcvtdq2ps_avx(auVar15);
  auVar249 = vsubps_avx(auVar249,auVar128);
  auVar291 = vfmadd213ps_fma(auVar249,auVar247,auVar128);
  auVar128 = vcvtdq2ps_avx(auVar162);
  auVar249 = vcvtdq2ps_avx(auVar13);
  auVar249 = vsubps_avx(auVar249,auVar128);
  auVar240 = vfmadd213ps_fma(auVar249,auVar247,auVar128);
  auVar128 = vcvtdq2ps_avx(auVar126);
  auVar249 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x18 + 6));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar249 = vsubps_avx(auVar249,auVar128);
  auVar4 = vfmadd213ps_fma(auVar249,auVar247,auVar128);
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x1d + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar249 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x21 + 6));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar249 = vsubps_avx(auVar249,auVar128);
  auVar175 = vfmadd213ps_fma(auVar249,auVar247,auVar128);
  auVar279 = ZEXT1664(auVar175);
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x1f + 6));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar249 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x23 + 6));
  auVar249 = vcvtdq2ps_avx(auVar249);
  auVar137 = vsubps_avx(auVar249,auVar128);
  auVar249 = vrcpps_avx(auVar168);
  auVar5 = vfmadd213ps_fma(auVar137,auVar247,auVar128);
  auVar285 = ZEXT1664(auVar5);
  auVar158._8_4_ = 0x3f800000;
  auVar158._0_8_ = 0x3f8000003f800000;
  auVar158._12_4_ = 0x3f800000;
  auVar158._16_4_ = 0x3f800000;
  auVar158._20_4_ = 0x3f800000;
  auVar158._24_4_ = 0x3f800000;
  auVar158._28_4_ = 0x3f800000;
  auVar257 = vfnmadd213ps_fma(auVar168,auVar249,auVar158);
  auVar257 = vfmadd132ps_fma(ZEXT1632(auVar257),auVar249,auVar249);
  auVar168 = vrcpps_avx(auVar12);
  auVar113 = vfnmadd213ps_fma(auVar12,auVar168,auVar158);
  auVar12 = vrcpps_avx(auVar124);
  auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar168,auVar168);
  auVar290 = vfnmadd213ps_fma(auVar124,auVar12,auVar158);
  auVar290 = vfmadd132ps_fma(ZEXT1632(auVar290),auVar12,auVar12);
  auVar124 = vsubps_avx(ZEXT1632(auVar299),ZEXT1632(auVar256));
  auVar12._4_4_ = auVar124._4_4_ * auVar257._4_4_;
  auVar12._0_4_ = auVar124._0_4_ * auVar257._0_4_;
  auVar12._8_4_ = auVar124._8_4_ * auVar257._8_4_;
  auVar12._12_4_ = auVar124._12_4_ * auVar257._12_4_;
  auVar12._16_4_ = auVar124._16_4_ * 0.0;
  auVar12._20_4_ = auVar124._20_4_ * 0.0;
  auVar12._24_4_ = auVar124._24_4_ * 0.0;
  auVar12._28_4_ = auVar124._28_4_;
  auVar288 = ZEXT3264(auVar12);
  auVar124 = vsubps_avx(ZEXT1632(auVar291),ZEXT1632(auVar256));
  auVar249._4_4_ = auVar257._4_4_ * auVar124._4_4_;
  auVar249._0_4_ = auVar257._0_4_ * auVar124._0_4_;
  auVar249._8_4_ = auVar257._8_4_ * auVar124._8_4_;
  auVar249._12_4_ = auVar257._12_4_ * auVar124._12_4_;
  auVar249._16_4_ = auVar124._16_4_ * 0.0;
  auVar249._20_4_ = auVar124._20_4_ * 0.0;
  auVar249._24_4_ = auVar124._24_4_ * 0.0;
  auVar249._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(ZEXT1632(auVar240),ZEXT1632(auVar281));
  auVar137._4_4_ = auVar113._4_4_ * auVar124._4_4_;
  auVar137._0_4_ = auVar113._0_4_ * auVar124._0_4_;
  auVar137._8_4_ = auVar113._8_4_ * auVar124._8_4_;
  auVar137._12_4_ = auVar113._12_4_ * auVar124._12_4_;
  auVar137._16_4_ = auVar124._16_4_ * 0.0;
  auVar137._20_4_ = auVar124._20_4_ * 0.0;
  auVar137._24_4_ = auVar124._24_4_ * 0.0;
  auVar137._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar281));
  auVar162._4_4_ = auVar113._4_4_ * auVar124._4_4_;
  auVar162._0_4_ = auVar113._0_4_ * auVar124._0_4_;
  auVar162._8_4_ = auVar113._8_4_ * auVar124._8_4_;
  auVar162._12_4_ = auVar113._12_4_ * auVar124._12_4_;
  auVar162._16_4_ = auVar124._16_4_ * 0.0;
  auVar162._20_4_ = auVar124._20_4_ * 0.0;
  auVar162._24_4_ = auVar124._24_4_ * 0.0;
  auVar162._28_4_ = 0x3f800000;
  auVar124 = vsubps_avx(ZEXT1632(auVar175),ZEXT1632(auVar110));
  auVar13._4_4_ = auVar290._4_4_ * auVar124._4_4_;
  auVar13._0_4_ = auVar290._0_4_ * auVar124._0_4_;
  auVar13._8_4_ = auVar290._8_4_ * auVar124._8_4_;
  auVar13._12_4_ = auVar290._12_4_ * auVar124._12_4_;
  auVar13._16_4_ = auVar124._16_4_ * 0.0;
  auVar13._20_4_ = auVar124._20_4_ * 0.0;
  auVar13._24_4_ = auVar124._24_4_ * 0.0;
  auVar13._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar110));
  auVar123._0_4_ = auVar290._0_4_ * auVar124._0_4_;
  auVar123._4_4_ = auVar290._4_4_ * auVar124._4_4_;
  auVar123._8_4_ = auVar290._8_4_ * auVar124._8_4_;
  auVar123._12_4_ = auVar290._12_4_ * auVar124._12_4_;
  auVar123._16_4_ = auVar124._16_4_ * 0.0;
  auVar123._20_4_ = auVar124._20_4_ * 0.0;
  auVar123._24_4_ = auVar124._24_4_ * 0.0;
  auVar123._28_4_ = 0;
  auVar124 = vpminsd_avx2(auVar12,auVar249);
  auVar168 = vpminsd_avx2(auVar137,auVar162);
  auVar124 = vmaxps_avx(auVar124,auVar168);
  auVar168 = vpminsd_avx2(auVar13,auVar123);
  uVar109 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar261._4_4_ = uVar109;
  auVar261._0_4_ = uVar109;
  auVar261._8_4_ = uVar109;
  auVar261._12_4_ = uVar109;
  auVar261._16_4_ = uVar109;
  auVar261._20_4_ = uVar109;
  auVar261._24_4_ = uVar109;
  auVar261._28_4_ = uVar109;
  auVar168 = vmaxps_avx(auVar168,auVar261);
  auVar124 = vmaxps_avx(auVar124,auVar168);
  local_360._4_4_ = auVar124._4_4_ * 0.99999964;
  local_360._0_4_ = auVar124._0_4_ * 0.99999964;
  local_360._8_4_ = auVar124._8_4_ * 0.99999964;
  local_360._12_4_ = auVar124._12_4_ * 0.99999964;
  local_360._16_4_ = auVar124._16_4_ * 0.99999964;
  local_360._20_4_ = auVar124._20_4_ * 0.99999964;
  local_360._24_4_ = auVar124._24_4_ * 0.99999964;
  local_360._28_4_ = 0x3f7ffffa;
  auVar124 = vpmaxsd_avx2(auVar12,auVar249);
  auVar168 = vpmaxsd_avx2(auVar137,auVar162);
  auVar124 = vminps_avx(auVar124,auVar168);
  fVar210 = ray->tfar;
  auVar181._4_4_ = fVar210;
  auVar181._0_4_ = fVar210;
  auVar181._8_4_ = fVar210;
  auVar181._12_4_ = fVar210;
  auVar181._16_4_ = fVar210;
  auVar181._20_4_ = fVar210;
  auVar181._24_4_ = fVar210;
  auVar181._28_4_ = fVar210;
  auVar168 = vpmaxsd_avx2(auVar13,auVar123);
  auVar168 = vminps_avx(auVar168,auVar181);
  auVar124 = vminps_avx(auVar124,auVar168);
  auVar129._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar129._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar129._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar129._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar129._16_4_ = auVar124._16_4_ * 1.0000004;
  auVar129._20_4_ = auVar124._20_4_ * 1.0000004;
  auVar129._24_4_ = auVar124._24_4_ * 1.0000004;
  auVar129._28_4_ = auVar124._28_4_;
  auVar159[4] = PVar6;
  auVar159._5_3_ = 0;
  auVar159[8] = PVar6;
  auVar159._9_3_ = 0;
  auVar159[0xc] = PVar6;
  auVar159._13_3_ = 0;
  auVar159[0x10] = PVar6;
  auVar159._17_3_ = 0;
  auVar159[0x14] = PVar6;
  auVar159._21_3_ = 0;
  auVar159[0x18] = PVar6;
  auVar159._25_3_ = 0;
  auVar159[0x1c] = PVar6;
  auVar159._29_3_ = 0;
  auVar124 = vcmpps_avx(local_360,auVar129,2);
  auVar168 = vpcmpgtd_avx2(auVar159,_DAT_01fb4ba0);
  auVar124 = vandps_avx(auVar124,auVar168);
  uVar101 = vmovmskps_avx(auVar124);
  auVar124._16_16_ = mm_lookupmask_ps._240_16_;
  auVar124._0_16_ = mm_lookupmask_ps._240_16_;
  local_780 = vblendps_avx(auVar124,ZEXT832(0) << 0x20,0x80);
LAB_013f4e97:
  local_848 = (ulong)uVar101;
  if (local_848 == 0) {
LAB_013f741a:
    return local_848 != 0;
  }
  lVar103 = 0;
  for (uVar99 = local_848; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
    lVar103 = lVar103 + 1;
  }
  uVar101 = *(uint *)(prim + 2);
  local_9a8 = (ulong)*(uint *)(prim + lVar103 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar101].ptr;
  uVar99 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_9a8 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar210 = (pGVar7->time_range).lower;
  fVar210 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar210) / ((pGVar7->time_range).upper - fVar210));
  auVar257 = vroundss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),9);
  auVar257 = vminss_avx(auVar257,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar257 = vmaxss_avx(ZEXT816(0) << 0x20,auVar257);
  fVar210 = fVar210 - auVar257._0_4_;
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar105 = (long)(int)auVar257._0_4_ * 0x38;
  lVar103 = *(long *)(_Var8 + 0x10 + lVar105);
  lVar9 = *(long *)(_Var8 + 0x38 + lVar105);
  lVar10 = *(long *)(_Var8 + 0x48 + lVar105);
  pfVar1 = (float *)(lVar9 + uVar99 * lVar10);
  auVar152._0_4_ = fVar210 * *pfVar1;
  auVar152._4_4_ = fVar210 * pfVar1[1];
  auVar152._8_4_ = fVar210 * pfVar1[2];
  auVar152._12_4_ = fVar210 * pfVar1[3];
  pfVar1 = (float *)(lVar9 + (uVar99 + 1) * lVar10);
  auVar171._0_4_ = fVar210 * *pfVar1;
  auVar171._4_4_ = fVar210 * pfVar1[1];
  auVar171._8_4_ = fVar210 * pfVar1[2];
  auVar171._12_4_ = fVar210 * pfVar1[3];
  pfVar1 = (float *)(lVar9 + (uVar99 + 2) * lVar10);
  auVar211._0_4_ = fVar210 * *pfVar1;
  auVar211._4_4_ = fVar210 * pfVar1[1];
  auVar211._8_4_ = fVar210 * pfVar1[2];
  auVar211._12_4_ = fVar210 * pfVar1[3];
  pfVar1 = (float *)(lVar9 + lVar10 * (uVar99 + 3));
  auVar191._0_4_ = fVar210 * *pfVar1;
  auVar191._4_4_ = fVar210 * pfVar1[1];
  auVar191._8_4_ = fVar210 * pfVar1[2];
  auVar191._12_4_ = fVar210 * pfVar1[3];
  lVar9 = *(long *)(_Var8 + lVar105);
  fVar210 = 1.0 - fVar210;
  auVar110._4_4_ = fVar210;
  auVar110._0_4_ = fVar210;
  auVar110._8_4_ = fVar210;
  auVar110._12_4_ = fVar210;
  auVar299 = vfmadd231ps_fma(auVar152,auVar110,*(undefined1 (*) [16])(lVar9 + lVar103 * uVar99));
  auVar291 = vfmadd231ps_fma(auVar171,auVar110,
                             *(undefined1 (*) [16])(lVar9 + lVar103 * (uVar99 + 1)));
  auVar240 = vfmadd231ps_fma(auVar211,auVar110,
                             *(undefined1 (*) [16])(lVar9 + lVar103 * (uVar99 + 2)));
  auVar4 = vfmadd231ps_fma(auVar191,auVar110,*(undefined1 (*) [16])(lVar9 + lVar103 * (uVar99 + 3)))
  ;
  auVar234._0_4_ = (auVar299._0_4_ + auVar291._0_4_ + auVar240._0_4_ + auVar4._0_4_) * 0.25;
  auVar234._4_4_ = (auVar299._4_4_ + auVar291._4_4_ + auVar240._4_4_ + auVar4._4_4_) * 0.25;
  auVar234._8_4_ = (auVar299._8_4_ + auVar291._8_4_ + auVar240._8_4_ + auVar4._8_4_) * 0.25;
  auVar234._12_4_ = (auVar299._12_4_ + auVar291._12_4_ + auVar240._12_4_ + auVar4._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar257 = vsubps_avx(auVar234,(undefined1  [16])aVar2);
  auVar257 = vdpps_avx(auVar257,(undefined1  [16])aVar3,0x7f);
  auVar113 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar290 = vrcpss_avx(auVar113,auVar113);
  auVar113 = vfnmadd213ss_fma(auVar290,auVar113,ZEXT416(0x40000000));
  auVar268 = ZEXT1664(auVar113);
  fVar210 = auVar290._0_4_ * auVar113._0_4_;
  auVar255 = ZEXT464((uint)fVar210);
  fVar210 = auVar257._0_4_ * fVar210;
  local_860 = ZEXT416((uint)fVar210);
  auVar235._4_4_ = fVar210;
  auVar235._0_4_ = fVar210;
  auVar235._8_4_ = fVar210;
  auVar235._12_4_ = fVar210;
  fStack_6f0 = fVar210;
  _local_700 = auVar235;
  fStack_6ec = fVar210;
  fStack_6e8 = fVar210;
  fStack_6e4 = fVar210;
  auVar257 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar235);
  auVar257 = vblendps_avx(auVar257,_DAT_01f45a50,8);
  auVar113 = vsubps_avx(auVar299,auVar257);
  auVar290 = vsubps_avx(auVar240,auVar257);
  auVar226 = ZEXT1664(auVar290);
  local_a80 = vsubps_avx(auVar291,auVar257);
  _local_a90 = vsubps_avx(auVar4,auVar257);
  auVar257 = vmovshdup_avx(auVar113);
  local_400 = auVar257._0_8_;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  auVar257 = vshufps_avx(auVar113,auVar113,0xaa);
  local_420 = auVar257._0_8_;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  auVar257 = vshufps_avx(auVar113,auVar113,0xff);
  local_1e0 = auVar257._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar257 = vmovshdup_avx(local_a80);
  local_440 = auVar257._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar257 = vshufps_avx(local_a80,local_a80,0xaa);
  local_200 = auVar257._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar257 = vshufps_avx(local_a80,local_a80,0xff);
  local_220 = auVar257._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar257 = vmovshdup_avx(auVar290);
  local_240 = auVar257._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar257 = vshufps_avx(auVar290,auVar290,0xaa);
  local_460 = auVar257._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar257 = vshufps_avx(auVar290,auVar290,0xff);
  local_480 = auVar257._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar257 = vmovshdup_avx(_local_a90);
  local_4a0 = auVar257._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar257 = vshufps_avx(_local_a90,_local_a90,0xaa);
  local_4c0 = auVar257._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar257 = vshufps_avx(_local_a90,_local_a90,0xff);
  local_4e0 = auVar257._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar111._0_4_ = aVar3.x * aVar3.x;
  auVar111._4_4_ = aVar3.y * aVar3.y;
  auVar111._8_4_ = aVar3.z * aVar3.z;
  auVar111._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar257 = vshufps_avx(auVar111,auVar111,0xaa);
  uVar109 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_620._4_4_ = uVar109;
  local_620._0_4_ = uVar109;
  local_620._8_4_ = uVar109;
  local_620._12_4_ = uVar109;
  local_620._16_4_ = uVar109;
  local_620._20_4_ = uVar109;
  local_620._24_4_ = uVar109;
  local_620._28_4_ = uVar109;
  auVar125._0_8_ = auVar257._0_8_;
  auVar125._8_8_ = auVar125._0_8_;
  auVar125._16_8_ = auVar125._0_8_;
  auVar125._24_8_ = auVar125._0_8_;
  auVar257 = vfmadd231ps_fma(auVar125,local_620,local_620);
  uVar109 = *(undefined4 *)&(ray->dir).field_0;
  local_640._4_4_ = uVar109;
  local_640._0_4_ = uVar109;
  fStack_638 = (float)uVar109;
  fStack_634 = (float)uVar109;
  fStack_630 = (float)uVar109;
  fStack_62c = (float)uVar109;
  fStack_628 = (float)uVar109;
  register0x0000125c = uVar109;
  auVar257 = vfmadd231ps_fma(ZEXT1632(auVar257),_local_640,_local_640);
  uVar99 = 0;
  bVar106 = 0;
  local_b44 = 1;
  local_720 = (ray->dir).field_0.m128[2];
  local_880._0_16_ = auVar113;
  local_500 = auVar113._0_4_;
  uStack_4fc = local_500;
  uStack_4f8 = local_500;
  uStack_4f4 = local_500;
  uStack_4f0 = local_500;
  uStack_4ec = local_500;
  uStack_4e8 = local_500;
  uStack_4e4 = local_500;
  local_280 = local_a80._0_4_;
  uStack_27c = local_280;
  uStack_278 = local_280;
  uStack_274 = local_280;
  uStack_270 = local_280;
  uStack_26c = local_280;
  uStack_268 = local_280;
  uStack_264 = local_280;
  local_8a0._0_16_ = auVar290;
  local_520 = auVar290._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  local_540 = local_a90._0_4_;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  local_260 = ZEXT1632(auVar257);
  local_560 = vandps_avx(ZEXT1632(auVar257),local_740);
  local_5f0 = ZEXT816(0x3f80000000000000);
  fStack_71c = local_720;
  fStack_718 = local_720;
  fStack_714 = local_720;
  fStack_710 = local_720;
  fStack_70c = local_720;
  fStack_708 = local_720;
  fStack_704 = local_720;
  do {
    auVar292._8_4_ = 0x3f800000;
    auVar292._0_8_ = 0x3f8000003f800000;
    auVar292._12_4_ = 0x3f800000;
    auVar292._16_4_ = 0x3f800000;
    auVar292._20_4_ = 0x3f800000;
    auVar292._24_4_ = 0x3f800000;
    auVar292._28_4_ = 0x3f800000;
    auVar257 = vmovshdup_avx(local_5f0);
    auVar257 = vsubps_avx(auVar257,local_5f0);
    local_800._0_4_ = auVar257._0_4_;
    fVar298 = local_800._0_4_ * 0.04761905;
    uVar109 = local_5f0._0_4_;
    local_7e0._4_4_ = uVar109;
    local_7e0._0_4_ = uVar109;
    local_7e0._8_4_ = uVar109;
    local_7e0._12_4_ = uVar109;
    local_7e0._16_4_ = uVar109;
    local_7e0._20_4_ = uVar109;
    local_7e0._24_4_ = uVar109;
    local_7e0._28_4_ = uVar109;
    local_800._4_4_ = local_800._0_4_;
    local_800._8_4_ = local_800._0_4_;
    local_800._12_4_ = local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    auVar257 = vfmadd231ps_fma(local_7e0,local_800,_DAT_01f7b040);
    auVar124 = vsubps_avx(auVar292,ZEXT1632(auVar257));
    fVar210 = auVar124._0_4_;
    fVar228 = auVar124._4_4_;
    fVar289 = auVar124._8_4_;
    fVar294 = auVar124._12_4_;
    fVar231 = auVar124._16_4_;
    fVar232 = auVar124._20_4_;
    fVar233 = auVar124._24_4_;
    fVar108 = fVar210 * fVar210 * fVar210;
    fVar146 = fVar228 * fVar228 * fVar228;
    fVar147 = fVar289 * fVar289 * fVar289;
    fVar148 = fVar294 * fVar294 * fVar294;
    fVar149 = fVar231 * fVar231 * fVar231;
    fVar150 = fVar232 * fVar232 * fVar232;
    fVar151 = fVar233 * fVar233 * fVar233;
    fVar227 = auVar257._0_4_;
    fVar229 = auVar257._4_4_;
    fVar293 = auVar257._8_4_;
    fVar230 = auVar257._12_4_;
    fVar170 = fVar227 * fVar227 * fVar227;
    fVar188 = fVar229 * fVar229 * fVar229;
    fVar189 = fVar293 * fVar293 * fVar293;
    fVar190 = fVar230 * fVar230 * fVar230;
    fVar265 = fVar210 * fVar227;
    fVar269 = fVar228 * fVar229;
    fVar270 = fVar289 * fVar293;
    fVar271 = fVar294 * fVar230;
    fVar272 = fVar231 * 0.0;
    fVar273 = fVar232 * 0.0;
    fVar274 = fVar233 * 0.0;
    fVar280 = auVar279._28_4_ + auVar288._28_4_;
    auVar17._4_4_ = fVar146 * 0.16666667;
    auVar17._0_4_ = fVar108 * 0.16666667;
    auVar17._8_4_ = fVar147 * 0.16666667;
    auVar17._12_4_ = fVar148 * 0.16666667;
    auVar17._16_4_ = fVar149 * 0.16666667;
    auVar17._20_4_ = fVar150 * 0.16666667;
    auVar17._24_4_ = fVar151 * 0.16666667;
    auVar17._28_4_ = fVar280 + local_800._0_4_;
    auVar18._4_4_ =
         (fVar228 * fVar269 * 12.0 + fVar269 * fVar229 * 6.0 + fVar188 + fVar146 * 4.0) * 0.16666667
    ;
    auVar18._0_4_ =
         (fVar210 * fVar265 * 12.0 + fVar265 * fVar227 * 6.0 + fVar170 + fVar108 * 4.0) * 0.16666667
    ;
    auVar18._8_4_ =
         (fVar289 * fVar270 * 12.0 + fVar270 * fVar293 * 6.0 + fVar189 + fVar147 * 4.0) * 0.16666667
    ;
    auVar18._12_4_ =
         (fVar294 * fVar271 * 12.0 + fVar271 * fVar230 * 6.0 + fVar190 + fVar148 * 4.0) * 0.16666667
    ;
    auVar18._16_4_ =
         (fVar231 * fVar272 * 12.0 + fVar272 * 0.0 * 6.0 + fVar149 * 4.0 + 0.0) * 0.16666667;
    auVar18._20_4_ =
         (fVar232 * fVar273 * 12.0 + fVar273 * 0.0 * 6.0 + fVar150 * 4.0 + 0.0) * 0.16666667;
    auVar18._24_4_ =
         (fVar233 * fVar274 * 12.0 + fVar274 * 0.0 * 6.0 + fVar151 * 4.0 + 0.0) * 0.16666667;
    auVar18._28_4_ = auVar285._28_4_;
    auVar19._4_4_ =
         (fVar188 * 4.0 + fVar146 + fVar269 * fVar229 * 12.0 + fVar228 * fVar269 * 6.0) * 0.16666667
    ;
    auVar19._0_4_ =
         (fVar170 * 4.0 + fVar108 + fVar265 * fVar227 * 12.0 + fVar210 * fVar265 * 6.0) * 0.16666667
    ;
    auVar19._8_4_ =
         (fVar189 * 4.0 + fVar147 + fVar270 * fVar293 * 12.0 + fVar289 * fVar270 * 6.0) * 0.16666667
    ;
    auVar19._12_4_ =
         (fVar190 * 4.0 + fVar148 + fVar271 * fVar230 * 12.0 + fVar294 * fVar271 * 6.0) * 0.16666667
    ;
    auVar19._16_4_ = (fVar149 + 0.0 + fVar272 * 0.0 * 12.0 + fVar231 * fVar272 * 6.0) * 0.16666667;
    auVar19._20_4_ = (fVar150 + 0.0 + fVar273 * 0.0 * 12.0 + fVar232 * fVar273 * 6.0) * 0.16666667;
    auVar19._24_4_ = (fVar151 + 0.0 + fVar274 * 0.0 * 12.0 + fVar233 * fVar274 * 6.0) * 0.16666667;
    auVar19._28_4_ = auVar288._28_4_;
    fVar170 = fVar170 * 0.16666667;
    fVar188 = fVar188 * 0.16666667;
    fVar189 = fVar189 * 0.16666667;
    fVar190 = fVar190 * 0.16666667;
    auVar20._4_4_ = fVar188 * fStack_53c;
    auVar20._0_4_ = fVar170 * local_540;
    auVar20._8_4_ = fVar189 * fStack_538;
    auVar20._12_4_ = fVar190 * fStack_534;
    auVar20._16_4_ = fStack_530 * 0.0;
    auVar20._20_4_ = fStack_52c * 0.0;
    auVar20._24_4_ = fStack_528 * 0.0;
    auVar20._28_4_ = local_800._0_4_;
    auVar21._4_4_ = fVar188 * local_4a0._4_4_;
    auVar21._0_4_ = fVar170 * (float)local_4a0;
    auVar21._8_4_ = fVar189 * (float)uStack_498;
    auVar21._12_4_ = fVar190 * uStack_498._4_4_;
    auVar21._16_4_ = (float)uStack_490 * 0.0;
    auVar21._20_4_ = uStack_490._4_4_ * 0.0;
    auVar21._24_4_ = (float)uStack_488 * 0.0;
    auVar21._28_4_ = 0x3e2aaaab;
    auVar22._4_4_ = fVar188 * local_4c0._4_4_;
    auVar22._0_4_ = fVar170 * (float)local_4c0;
    auVar22._8_4_ = fVar189 * (float)uStack_4b8;
    auVar22._12_4_ = fVar190 * uStack_4b8._4_4_;
    auVar22._16_4_ = (float)uStack_4b0 * 0.0;
    auVar22._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar22._24_4_ = (float)uStack_4a8 * 0.0;
    auVar22._28_4_ = fVar280 + DAT_01f7b040._28_4_ + 0.0;
    auVar23._4_4_ = fVar188 * local_4e0._4_4_;
    auVar23._0_4_ = fVar170 * (float)local_4e0;
    auVar23._8_4_ = fVar189 * (float)uStack_4d8;
    auVar23._12_4_ = fVar190 * uStack_4d8._4_4_;
    auVar23._16_4_ = (float)uStack_4d0 * 0.0;
    auVar23._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar23._24_4_ = (float)uStack_4c8 * 0.0;
    auVar23._28_4_ = 0;
    auVar76._4_4_ = uStack_51c;
    auVar76._0_4_ = local_520;
    auVar76._8_4_ = uStack_518;
    auVar76._12_4_ = uStack_514;
    auVar76._16_4_ = uStack_510;
    auVar76._20_4_ = uStack_50c;
    auVar76._24_4_ = uStack_508;
    auVar76._28_4_ = uStack_504;
    auVar257 = vfmadd231ps_fma(auVar20,auVar19,auVar76);
    auVar93._8_8_ = uStack_238;
    auVar93._0_8_ = local_240;
    auVar93._16_8_ = uStack_230;
    auVar93._24_8_ = uStack_228;
    auVar113 = vfmadd231ps_fma(auVar21,auVar19,auVar93);
    auVar82._8_8_ = uStack_458;
    auVar82._0_8_ = local_460;
    auVar82._16_8_ = uStack_450;
    auVar82._24_8_ = uStack_448;
    auVar290 = vfmadd231ps_fma(auVar22,auVar19,auVar82);
    auVar80._8_8_ = uStack_478;
    auVar80._0_8_ = local_480;
    auVar80._16_8_ = uStack_470;
    auVar80._24_8_ = uStack_468;
    auVar299 = vfmadd231ps_fma(auVar23,auVar19,auVar80);
    auVar92._4_4_ = uStack_27c;
    auVar92._0_4_ = local_280;
    auVar92._8_4_ = uStack_278;
    auVar92._12_4_ = uStack_274;
    auVar92._16_4_ = uStack_270;
    auVar92._20_4_ = uStack_26c;
    auVar92._24_4_ = uStack_268;
    auVar92._28_4_ = uStack_264;
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar18,auVar92);
    auVar84._8_8_ = uStack_438;
    auVar84._0_8_ = local_440;
    auVar84._16_8_ = uStack_430;
    auVar84._24_8_ = uStack_428;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar18,auVar84);
    auVar95._8_8_ = uStack_1f8;
    auVar95._0_8_ = local_200;
    auVar95._16_8_ = uStack_1f0;
    auVar95._24_8_ = uStack_1e8;
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar18,auVar95);
    auVar94._8_8_ = uStack_218;
    auVar94._0_8_ = local_220;
    auVar94._16_8_ = uStack_210;
    auVar94._24_8_ = uStack_208;
    auVar299 = vfmadd231ps_fma(ZEXT1632(auVar299),auVar94,auVar18);
    auVar78._4_4_ = uStack_4fc;
    auVar78._0_4_ = local_500;
    auVar78._8_4_ = uStack_4f8;
    auVar78._12_4_ = uStack_4f4;
    auVar78._16_4_ = uStack_4f0;
    auVar78._20_4_ = uStack_4ec;
    auVar78._24_4_ = uStack_4e8;
    auVar78._28_4_ = uStack_4e4;
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar17,auVar78);
    auVar126 = ZEXT1632(auVar257);
    auVar88._8_8_ = uStack_3f8;
    auVar88._0_8_ = local_400;
    auVar88._16_8_ = uStack_3f0;
    auVar88._24_8_ = uStack_3e8;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar17,auVar88);
    auVar86._8_8_ = uStack_418;
    auVar86._0_8_ = local_420;
    auVar86._16_8_ = uStack_410;
    auVar86._24_8_ = uStack_408;
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar17,auVar86);
    auVar96._8_8_ = uStack_1d8;
    auVar96._0_8_ = local_1e0;
    auVar96._16_8_ = uStack_1d0;
    auVar96._24_8_ = uStack_1c8;
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar299),auVar96,auVar17);
    local_900 = -0.0;
    uStack_8fc = 0x80000000;
    uStack_8f8 = 0x80000000;
    uStack_8f4 = 0x80000000;
    uStack_8f0 = 0x80000000;
    uStack_8ec = 0x80000000;
    uStack_8e8 = 0x80000000;
    uStack_8e4 = 0x80000000;
    auVar248._0_4_ = -fVar227 * fVar227;
    auVar248._4_4_ = -fVar229 * fVar229;
    auVar248._8_4_ = -fVar293 * fVar293;
    auVar248._12_4_ = -fVar230 * fVar230;
    auVar248._16_4_ = 0x80000000;
    auVar248._20_4_ = 0x80000000;
    auVar248._24_4_ = 0x80000000;
    auVar248._28_4_ = 0;
    auVar24._4_4_ = fVar269 * 4.0;
    auVar24._0_4_ = fVar265 * 4.0;
    auVar24._8_4_ = fVar270 * 4.0;
    auVar24._12_4_ = fVar271 * 4.0;
    auVar24._16_4_ = fVar272 * 4.0;
    auVar24._20_4_ = fVar273 * 4.0;
    fVar108 = auVar268._28_4_;
    auVar24._24_4_ = fVar274 * 4.0;
    auVar24._28_4_ = fVar108;
    auVar168 = vsubps_avx(auVar248,auVar24);
    fVar147 = fVar108 + auVar255._28_4_;
    auVar25._4_4_ = fVar228 * -fVar228 * 0.5;
    auVar25._0_4_ = fVar210 * -fVar210 * 0.5;
    auVar25._8_4_ = fVar289 * -fVar289 * 0.5;
    auVar25._12_4_ = fVar294 * -fVar294 * 0.5;
    auVar25._16_4_ = fVar231 * -fVar231 * 0.5;
    auVar25._20_4_ = fVar232 * -fVar232 * 0.5;
    auVar25._24_4_ = fVar233 * -fVar233 * 0.5;
    auVar25._28_4_ = auVar124._28_4_;
    auVar26._4_4_ = auVar168._4_4_ * 0.5;
    auVar26._0_4_ = auVar168._0_4_ * 0.5;
    auVar26._8_4_ = auVar168._8_4_ * 0.5;
    auVar26._12_4_ = auVar168._12_4_ * 0.5;
    auVar26._16_4_ = auVar168._16_4_ * 0.5;
    auVar26._20_4_ = auVar168._20_4_ * 0.5;
    fVar146 = auVar168._28_4_;
    auVar26._24_4_ = auVar168._24_4_ * 0.5;
    auVar26._28_4_ = fVar146;
    auVar27._4_4_ = (fVar269 * 4.0 + fVar228 * fVar228) * 0.5;
    auVar27._0_4_ = (fVar265 * 4.0 + fVar210 * fVar210) * 0.5;
    auVar27._8_4_ = (fVar270 * 4.0 + fVar289 * fVar289) * 0.5;
    auVar27._12_4_ = (fVar271 * 4.0 + fVar294 * fVar294) * 0.5;
    auVar27._16_4_ = (fVar272 * 4.0 + fVar231 * fVar231) * 0.5;
    auVar27._20_4_ = (fVar273 * 4.0 + fVar232 * fVar232) * 0.5;
    auVar27._24_4_ = (fVar274 * 4.0 + fVar233 * fVar233) * 0.5;
    auVar27._28_4_ = fVar147;
    fVar210 = fVar227 * fVar227 * 0.5;
    fVar227 = fVar229 * fVar229 * 0.5;
    fVar228 = fVar293 * fVar293 * 0.5;
    fVar229 = fVar230 * fVar230 * 0.5;
    auVar28._4_4_ = fVar227 * fStack_53c;
    auVar28._0_4_ = fVar210 * local_540;
    auVar28._8_4_ = fVar228 * fStack_538;
    auVar28._12_4_ = fVar229 * fStack_534;
    auVar28._16_4_ = fStack_530 * 0.0;
    auVar28._20_4_ = fStack_52c * 0.0;
    auVar28._24_4_ = fStack_528 * 0.0;
    auVar28._28_4_ = fVar108;
    auVar29._4_4_ = fVar227 * local_4a0._4_4_;
    auVar29._0_4_ = fVar210 * (float)local_4a0;
    auVar29._8_4_ = fVar228 * (float)uStack_498;
    auVar29._12_4_ = fVar229 * uStack_498._4_4_;
    auVar29._16_4_ = (float)uStack_490 * 0.0;
    auVar29._20_4_ = uStack_490._4_4_ * 0.0;
    auVar29._24_4_ = (float)uStack_488 * 0.0;
    auVar29._28_4_ = 0x80000000;
    auVar30._4_4_ = fVar227 * local_4c0._4_4_;
    auVar30._0_4_ = fVar210 * (float)local_4c0;
    auVar30._8_4_ = fVar228 * (float)uStack_4b8;
    auVar30._12_4_ = fVar229 * uStack_4b8._4_4_;
    auVar30._16_4_ = (float)uStack_4b0 * 0.0;
    auVar30._20_4_ = uStack_4b0._4_4_ * 0.0;
    auVar30._24_4_ = (float)uStack_4a8 * 0.0;
    auVar30._28_4_ = auVar285._28_4_;
    auVar31._4_4_ = fVar227 * local_4e0._4_4_;
    auVar31._0_4_ = fVar210 * (float)local_4e0;
    auVar31._8_4_ = fVar228 * (float)uStack_4d8;
    auVar31._12_4_ = fVar229 * uStack_4d8._4_4_;
    auVar31._16_4_ = (float)uStack_4d0 * 0.0;
    auVar31._20_4_ = uStack_4d0._4_4_ * 0.0;
    auVar31._24_4_ = (float)uStack_4c8 * 0.0;
    auVar31._28_4_ = auVar226._28_4_;
    auVar77._4_4_ = uStack_51c;
    auVar77._0_4_ = local_520;
    auVar77._8_4_ = uStack_518;
    auVar77._12_4_ = uStack_514;
    auVar77._16_4_ = uStack_510;
    auVar77._20_4_ = uStack_50c;
    auVar77._24_4_ = uStack_508;
    auVar77._28_4_ = uStack_504;
    auVar299 = vfmadd231ps_fma(auVar28,auVar27,auVar77);
    auVar291 = vfmadd231ps_fma(auVar29,auVar27,auVar93);
    auVar83._8_8_ = uStack_458;
    auVar83._0_8_ = local_460;
    auVar83._16_8_ = uStack_450;
    auVar83._24_8_ = uStack_448;
    auVar240 = vfmadd231ps_fma(auVar30,auVar27,auVar83);
    auVar81._8_8_ = uStack_478;
    auVar81._0_8_ = local_480;
    auVar81._16_8_ = uStack_470;
    auVar81._24_8_ = uStack_468;
    auVar4 = vfmadd231ps_fma(auVar31,auVar27,auVar81);
    auVar299 = vfmadd231ps_fma(ZEXT1632(auVar299),auVar26,auVar92);
    auVar85._8_8_ = uStack_438;
    auVar85._0_8_ = local_440;
    auVar85._16_8_ = uStack_430;
    auVar85._24_8_ = uStack_428;
    auVar291 = vfmadd231ps_fma(ZEXT1632(auVar291),auVar26,auVar85);
    auVar240 = vfmadd231ps_fma(ZEXT1632(auVar240),auVar26,auVar95);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar94,auVar26);
    auVar79._4_4_ = uStack_4fc;
    auVar79._0_4_ = local_500;
    auVar79._8_4_ = uStack_4f8;
    auVar79._12_4_ = uStack_4f4;
    auVar79._16_4_ = uStack_4f0;
    auVar79._20_4_ = uStack_4ec;
    auVar79._24_4_ = uStack_4e8;
    auVar79._28_4_ = uStack_4e4;
    auVar299 = vfmadd231ps_fma(ZEXT1632(auVar299),auVar25,auVar79);
    auVar89._8_8_ = uStack_3f8;
    auVar89._0_8_ = local_400;
    auVar89._16_8_ = uStack_3f0;
    auVar89._24_8_ = uStack_3e8;
    auVar291 = vfmadd231ps_fma(ZEXT1632(auVar291),auVar25,auVar89);
    auVar87._8_8_ = uStack_418;
    auVar87._0_8_ = local_420;
    auVar87._16_8_ = uStack_410;
    auVar87._24_8_ = uStack_408;
    auVar240 = vfmadd231ps_fma(ZEXT1632(auVar240),auVar25,auVar87);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar96,auVar25);
    fVar289 = auVar299._0_4_ * fVar298;
    fVar293 = auVar299._4_4_ * fVar298;
    local_920._4_4_ = fVar293;
    local_920._0_4_ = fVar289;
    fVar294 = auVar299._8_4_ * fVar298;
    local_920._8_4_ = fVar294;
    fVar108 = auVar299._12_4_ * fVar298;
    local_920._12_4_ = fVar108;
    local_920._16_4_ = fVar298 * 0.0;
    local_920._20_4_ = fVar298 * 0.0;
    local_920._24_4_ = fVar298 * 0.0;
    local_920._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    local_7c0._0_4_ = auVar291._0_4_ * fVar298;
    local_7c0._4_4_ = auVar291._4_4_ * fVar298;
    local_7c0._8_4_ = auVar291._8_4_ * fVar298;
    local_7c0._12_4_ = auVar291._12_4_ * fVar298;
    local_7c0._16_4_ = fVar298 * 0.0;
    local_7c0._20_4_ = fVar298 * 0.0;
    local_7c0._24_4_ = fVar298 * 0.0;
    local_7c0._28_4_ = 0;
    fVar280 = auVar240._0_4_ * fVar298;
    fVar302 = auVar240._4_4_ * fVar298;
    auVar32._4_4_ = fVar302;
    auVar32._0_4_ = fVar280;
    fVar303 = auVar240._8_4_ * fVar298;
    auVar32._8_4_ = fVar303;
    fVar304 = auVar240._12_4_ * fVar298;
    auVar32._12_4_ = fVar304;
    fVar305 = fVar298 * 0.0;
    auVar32._16_4_ = fVar305;
    fVar306 = fVar298 * 0.0;
    auVar32._20_4_ = fVar306;
    fVar307 = fVar298 * 0.0;
    auVar32._24_4_ = fVar307;
    auVar32._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    fVar210 = fVar298 * auVar4._0_4_;
    fVar227 = fVar298 * auVar4._4_4_;
    auVar33._4_4_ = fVar227;
    auVar33._0_4_ = fVar210;
    fVar228 = fVar298 * auVar4._8_4_;
    auVar33._8_4_ = fVar228;
    fVar229 = fVar298 * auVar4._12_4_;
    auVar33._12_4_ = fVar229;
    auVar33._16_4_ = fVar298 * 0.0;
    auVar33._20_4_ = fVar298 * 0.0;
    auVar33._24_4_ = fVar298 * 0.0;
    auVar33._28_4_ = fVar146;
    local_a00 = vpermps_avx2(_DAT_01fb7720,auVar126);
    local_ae0 = ZEXT1632(auVar257);
    local_7a0 = vpermps_avx2(_DAT_01fb7720,local_ae0);
    local_300 = vsubps_avx(local_a00,auVar126);
    local_2e0 = vsubps_avx(local_7a0,ZEXT1632(auVar257));
    fVar230 = local_2e0._0_4_;
    fVar231 = local_2e0._4_4_;
    auVar34._4_4_ = fVar231 * fVar293;
    auVar34._0_4_ = fVar230 * fVar289;
    fVar232 = local_2e0._8_4_;
    auVar34._8_4_ = fVar232 * fVar294;
    fVar233 = local_2e0._12_4_;
    auVar34._12_4_ = fVar233 * fVar108;
    fVar149 = local_2e0._16_4_;
    auVar34._16_4_ = fVar149 * fVar298 * 0.0;
    fVar150 = local_2e0._20_4_;
    auVar34._20_4_ = fVar150 * fVar298 * 0.0;
    fVar151 = local_2e0._24_4_;
    auVar34._24_4_ = fVar151 * fVar298 * 0.0;
    auVar34._28_4_ = local_a00._28_4_;
    auVar257 = vfmsub231ps_fma(auVar34,auVar32,local_300);
    local_a20 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar113));
    local_320 = vsubps_avx(local_a20,ZEXT1632(auVar113));
    fVar265 = local_300._0_4_;
    fVar269 = local_300._4_4_;
    auVar35._4_4_ = fVar269 * local_7c0._4_4_;
    auVar35._0_4_ = fVar265 * (float)local_7c0._0_4_;
    fVar270 = local_300._8_4_;
    auVar35._8_4_ = fVar270 * local_7c0._8_4_;
    fVar271 = local_300._12_4_;
    auVar35._12_4_ = fVar271 * local_7c0._12_4_;
    fVar272 = local_300._16_4_;
    auVar35._16_4_ = fVar272 * local_7c0._16_4_;
    fVar273 = local_300._20_4_;
    auVar35._20_4_ = fVar273 * local_7c0._20_4_;
    fVar274 = local_300._24_4_;
    auVar35._24_4_ = fVar274 * local_7c0._24_4_;
    auVar35._28_4_ = local_a20._28_4_;
    auVar299 = vfmsub231ps_fma(auVar35,local_920,local_320);
    auVar36._28_4_ = auVar124._28_4_;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(auVar299._12_4_ * auVar299._12_4_,
                            CONCAT48(auVar299._8_4_ * auVar299._8_4_,
                                     CONCAT44(auVar299._4_4_ * auVar299._4_4_,
                                              auVar299._0_4_ * auVar299._0_4_))));
    auVar257 = vfmadd231ps_fma(auVar36,ZEXT1632(auVar257),ZEXT1632(auVar257));
    auVar37._4_4_ = fVar231 * fVar231;
    auVar37._0_4_ = fVar230 * fVar230;
    auVar37._8_4_ = fVar232 * fVar232;
    auVar37._12_4_ = fVar233 * fVar233;
    auVar37._16_4_ = fVar149 * fVar149;
    auVar37._20_4_ = fVar150 * fVar150;
    auVar37._24_4_ = fVar151 * fVar151;
    auVar37._28_4_ = fVar147;
    auVar299 = vfmadd231ps_fma(auVar37,local_320,local_320);
    auVar299 = vfmadd231ps_fma(ZEXT1632(auVar299),local_300,local_300);
    fVar108 = local_320._0_4_;
    auVar206._0_4_ = fVar108 * fVar280;
    fVar147 = local_320._4_4_;
    auVar206._4_4_ = fVar147 * fVar302;
    fVar148 = local_320._8_4_;
    auVar206._8_4_ = fVar148 * fVar303;
    fVar170 = local_320._12_4_;
    auVar206._12_4_ = fVar170 * fVar304;
    fVar188 = local_320._16_4_;
    auVar206._16_4_ = fVar188 * fVar305;
    fVar189 = local_320._20_4_;
    auVar206._20_4_ = fVar189 * fVar306;
    fVar190 = local_320._24_4_;
    auVar206._24_4_ = fVar190 * fVar307;
    auVar206._28_4_ = 0;
    auVar124 = vrcpps_avx(ZEXT1632(auVar299));
    auVar291 = vfmsub231ps_fma(auVar206,local_7c0,local_2e0);
    auVar291 = vfmadd231ps_fma(ZEXT1632(auVar257),ZEXT1632(auVar291),ZEXT1632(auVar291));
    auVar160._8_4_ = 0x3f800000;
    auVar160._0_8_ = 0x3f8000003f800000;
    auVar160._12_4_ = 0x3f800000;
    auVar160._16_4_ = 0x3f800000;
    auVar160._20_4_ = 0x3f800000;
    auVar160._24_4_ = 0x3f800000;
    auVar160._28_4_ = 0x3f800000;
    auVar257 = vfnmadd213ps_fma(auVar124,ZEXT1632(auVar299),auVar160);
    auVar257 = vfmadd132ps_fma(ZEXT1632(auVar257),auVar124,auVar124);
    local_ac0 = vpermps_avx2(_DAT_01fb7720,local_920);
    local_a40 = vpermps_avx2(_DAT_01fb7720,auVar32);
    auVar38._4_4_ = fVar231 * local_ac0._4_4_;
    auVar38._0_4_ = fVar230 * local_ac0._0_4_;
    auVar38._8_4_ = fVar232 * local_ac0._8_4_;
    auVar38._12_4_ = fVar233 * local_ac0._12_4_;
    auVar38._16_4_ = fVar149 * local_ac0._16_4_;
    auVar38._20_4_ = fVar150 * local_ac0._20_4_;
    auVar38._24_4_ = fVar151 * local_ac0._24_4_;
    auVar38._28_4_ = auVar124._28_4_;
    auVar240 = vfmsub231ps_fma(auVar38,local_a40,local_300);
    local_960 = vpermps_avx2(_DAT_01fb7720,local_7c0);
    auVar39._4_4_ = fVar269 * local_960._4_4_;
    auVar39._0_4_ = fVar265 * local_960._0_4_;
    auVar39._8_4_ = fVar270 * local_960._8_4_;
    auVar39._12_4_ = fVar271 * local_960._12_4_;
    auVar39._16_4_ = fVar272 * local_960._16_4_;
    auVar39._20_4_ = fVar273 * local_960._20_4_;
    auVar39._24_4_ = fVar274 * local_960._24_4_;
    auVar39._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar39,local_ac0,local_320);
    auVar240 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar4._12_4_,
                                                  CONCAT48(auVar4._8_4_ * auVar4._8_4_,
                                                           CONCAT44(auVar4._4_4_ * auVar4._4_4_,
                                                                    auVar4._0_4_ * auVar4._0_4_)))),
                               ZEXT1632(auVar240),ZEXT1632(auVar240));
    auVar222._0_4_ = fVar108 * local_a40._0_4_;
    auVar222._4_4_ = fVar147 * local_a40._4_4_;
    auVar222._8_4_ = fVar148 * local_a40._8_4_;
    auVar222._12_4_ = fVar170 * local_a40._12_4_;
    auVar222._16_4_ = fVar188 * local_a40._16_4_;
    auVar222._20_4_ = fVar189 * local_a40._20_4_;
    auVar222._24_4_ = fVar190 * local_a40._24_4_;
    auVar222._28_4_ = 0;
    auVar4 = vfmsub231ps_fma(auVar222,local_960,local_2e0);
    auVar240 = vfmadd231ps_fma(ZEXT1632(auVar240),ZEXT1632(auVar4),ZEXT1632(auVar4));
    auVar124 = vmaxps_avx(ZEXT1632(CONCAT412(auVar291._12_4_ * auVar257._12_4_,
                                             CONCAT48(auVar291._8_4_ * auVar257._8_4_,
                                                      CONCAT44(auVar291._4_4_ * auVar257._4_4_,
                                                               auVar291._0_4_ * auVar257._0_4_)))),
                          ZEXT1632(CONCAT412(auVar240._12_4_ * auVar257._12_4_,
                                             CONCAT48(auVar240._8_4_ * auVar257._8_4_,
                                                      CONCAT44(auVar240._4_4_ * auVar257._4_4_,
                                                               auVar240._0_4_ * auVar257._0_4_)))));
    auVar223._0_4_ = fVar210 + auVar290._0_4_;
    auVar223._4_4_ = fVar227 + auVar290._4_4_;
    auVar223._8_4_ = fVar228 + auVar290._8_4_;
    auVar223._12_4_ = fVar229 + auVar290._12_4_;
    auVar223._16_4_ = fVar298 * 0.0 + 0.0;
    auVar223._20_4_ = fVar298 * 0.0 + 0.0;
    auVar223._24_4_ = fVar298 * 0.0 + 0.0;
    auVar223._28_4_ = fVar146 + 0.0;
    auVar168 = vsubps_avx(ZEXT1632(auVar290),auVar33);
    auVar14 = vpermps_avx2(_DAT_01fb7720,auVar168);
    auVar122 = ZEXT1632(auVar290);
    auVar15 = vpermps_avx2(_DAT_01fb7720,auVar122);
    auVar168 = vmaxps_avx(auVar122,auVar223);
    auVar128 = vrsqrtps_avx(ZEXT1632(auVar299));
    auVar12 = vmaxps_avx(auVar14,auVar15);
    auVar12 = vmaxps_avx(auVar168,auVar12);
    uVar109 = auVar168._28_4_;
    fVar210 = auVar128._0_4_;
    fVar227 = auVar128._4_4_;
    fVar228 = auVar128._8_4_;
    fVar229 = auVar128._12_4_;
    fVar289 = auVar128._16_4_;
    fVar293 = auVar128._20_4_;
    fVar294 = auVar128._24_4_;
    auVar277._0_4_ = fVar210 * fVar210 * fVar210 * auVar299._0_4_ * -0.5;
    auVar277._4_4_ = fVar227 * fVar227 * fVar227 * auVar299._4_4_ * -0.5;
    auVar277._8_4_ = fVar228 * fVar228 * fVar228 * auVar299._8_4_ * -0.5;
    auVar277._12_4_ = fVar229 * fVar229 * fVar229 * auVar299._12_4_ * -0.5;
    auVar277._16_4_ = fVar289 * fVar289 * fVar289 * -0.0;
    auVar277._20_4_ = fVar293 * fVar293 * fVar293 * -0.0;
    auVar277._24_4_ = fVar294 * fVar294 * fVar294 * -0.0;
    auVar277._28_4_ = 0;
    auVar127._8_4_ = 0x3fc00000;
    auVar127._0_8_ = 0x3fc000003fc00000;
    auVar127._12_4_ = 0x3fc00000;
    auVar127._16_4_ = 0x3fc00000;
    auVar127._20_4_ = 0x3fc00000;
    auVar127._24_4_ = 0x3fc00000;
    auVar127._28_4_ = 0x3fc00000;
    auVar257 = vfmadd231ps_fma(auVar277,auVar127,auVar128);
    auVar279 = ZEXT1664(auVar257);
    fVar227 = auVar257._0_4_;
    fVar228 = auVar257._4_4_;
    auVar40._4_4_ = fVar147 * fVar228;
    auVar40._0_4_ = fVar108 * fVar227;
    fVar289 = auVar257._8_4_;
    auVar40._8_4_ = fVar148 * fVar289;
    fVar294 = auVar257._12_4_;
    auVar40._12_4_ = fVar170 * fVar294;
    auVar40._16_4_ = fVar188 * 0.0;
    auVar40._20_4_ = fVar189 * 0.0;
    auVar40._24_4_ = fVar190 * 0.0;
    auVar40._28_4_ = uVar109;
    auVar41._4_4_ = fStack_71c * fVar231 * fVar228;
    auVar41._0_4_ = local_720 * fVar230 * fVar227;
    auVar41._8_4_ = fStack_718 * fVar232 * fVar289;
    auVar41._12_4_ = fStack_714 * fVar233 * fVar294;
    auVar41._16_4_ = fStack_710 * fVar149 * 0.0;
    auVar41._20_4_ = fStack_70c * fVar150 * 0.0;
    auVar41._24_4_ = fStack_708 * fVar151 * 0.0;
    auVar41._28_4_ = local_320._28_4_;
    auVar257 = vfmadd231ps_fma(auVar41,auVar40,local_620);
    auVar128 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar168 = vsubps_avx(auVar128,local_ae0);
    fVar298 = auVar168._0_4_;
    fVar108 = auVar168._4_4_;
    auVar42._4_4_ = fVar108 * fVar231 * fVar228;
    auVar42._0_4_ = fVar298 * fVar230 * fVar227;
    fVar146 = auVar168._8_4_;
    auVar42._8_4_ = fVar146 * fVar232 * fVar289;
    fVar147 = auVar168._12_4_;
    auVar42._12_4_ = fVar147 * fVar233 * fVar294;
    fVar148 = auVar168._16_4_;
    auVar42._16_4_ = fVar148 * fVar149 * 0.0;
    fVar149 = auVar168._20_4_;
    auVar42._20_4_ = fVar149 * fVar150 * 0.0;
    fVar150 = auVar168._24_4_;
    auVar42._24_4_ = fVar150 * fVar151 * 0.0;
    auVar42._28_4_ = local_a40._28_4_;
    local_340 = ZEXT1632(auVar113);
    auVar128 = vsubps_avx(auVar128,local_340);
    auVar255 = ZEXT3264(auVar128);
    auVar113 = vfmadd231ps_fma(auVar42,auVar128,auVar40);
    auVar43._4_4_ = fVar269 * fVar228;
    auVar43._0_4_ = fVar265 * fVar227;
    auVar43._8_4_ = fVar270 * fVar289;
    auVar43._12_4_ = fVar271 * fVar294;
    auVar43._16_4_ = fVar272 * 0.0;
    auVar43._20_4_ = fVar273 * 0.0;
    auVar43._24_4_ = fVar274 * 0.0;
    auVar43._28_4_ = uVar109;
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar43,_local_640);
    auVar285 = ZEXT1664(auVar257);
    auVar129 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar249 = vsubps_avx(auVar129,auVar126);
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar249,auVar43);
    auVar44._4_4_ = fStack_71c * fVar108;
    auVar44._0_4_ = local_720 * fVar298;
    auVar44._8_4_ = fStack_718 * fVar146;
    auVar44._12_4_ = fStack_714 * fVar147;
    auVar44._16_4_ = fStack_710 * fVar148;
    auVar44._20_4_ = fStack_70c * fVar149;
    auVar44._24_4_ = fStack_708 * fVar150;
    auVar44._28_4_ = uVar109;
    auVar290 = vfmadd231ps_fma(auVar44,local_620,auVar128);
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar290),_local_640,auVar249);
    fVar210 = auVar113._0_4_;
    fVar151 = auVar257._0_4_;
    fVar229 = auVar113._4_4_;
    fVar170 = auVar257._4_4_;
    fVar293 = auVar113._8_4_;
    fVar188 = auVar257._8_4_;
    fVar230 = auVar113._12_4_;
    fVar189 = auVar257._12_4_;
    auVar45._28_4_ = local_640._28_4_;
    auVar45._0_28_ =
         ZEXT1628(CONCAT412(fVar189 * fVar230,
                            CONCAT48(fVar188 * fVar293,CONCAT44(fVar170 * fVar229,fVar151 * fVar210)
                                    )));
    auVar137 = vsubps_avx(ZEXT1632(auVar290),auVar45);
    auVar46._4_4_ = fVar108 * fVar108;
    auVar46._0_4_ = fVar298 * fVar298;
    auVar46._8_4_ = fVar146 * fVar146;
    auVar46._12_4_ = fVar147 * fVar147;
    auVar46._16_4_ = fVar148 * fVar148;
    auVar46._20_4_ = fVar149 * fVar149;
    auVar46._24_4_ = fVar150 * fVar150;
    auVar46._28_4_ = local_640._28_4_;
    auVar290 = vfmadd231ps_fma(auVar46,auVar128,auVar128);
    auVar290 = vfmadd231ps_fma(ZEXT1632(auVar290),auVar249,auVar249);
    auVar47._28_4_ = local_620._28_4_;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * fVar230,
                            CONCAT48(fVar293 * fVar293,CONCAT44(fVar229 * fVar229,fVar210 * fVar210)
                                    )));
    auVar162 = vsubps_avx(ZEXT1632(auVar290),auVar47);
    local_2c0 = vsqrtps_avx(auVar124);
    fVar210 = (auVar12._0_4_ + local_2c0._0_4_) * 1.0000002;
    fVar229 = (auVar12._4_4_ + local_2c0._4_4_) * 1.0000002;
    fVar293 = (auVar12._8_4_ + local_2c0._8_4_) * 1.0000002;
    fVar230 = (auVar12._12_4_ + local_2c0._12_4_) * 1.0000002;
    fVar231 = (auVar12._16_4_ + local_2c0._16_4_) * 1.0000002;
    fVar232 = (auVar12._20_4_ + local_2c0._20_4_) * 1.0000002;
    fVar233 = (auVar12._24_4_ + local_2c0._24_4_) * 1.0000002;
    auVar48._4_4_ = fVar229 * fVar229;
    auVar48._0_4_ = fVar210 * fVar210;
    auVar48._8_4_ = fVar293 * fVar293;
    auVar48._12_4_ = fVar230 * fVar230;
    auVar48._16_4_ = fVar231 * fVar231;
    auVar48._20_4_ = fVar232 * fVar232;
    auVar48._24_4_ = fVar233 * fVar233;
    auVar48._28_4_ = auVar12._28_4_ + local_2c0._28_4_;
    fVar229 = auVar137._0_4_ + auVar137._0_4_;
    fVar293 = auVar137._4_4_ + auVar137._4_4_;
    local_3c0._0_8_ = CONCAT44(fVar293,fVar229);
    local_3c0._8_4_ = auVar137._8_4_ + auVar137._8_4_;
    local_3c0._12_4_ = auVar137._12_4_ + auVar137._12_4_;
    local_3c0._16_4_ = auVar137._16_4_ + auVar137._16_4_;
    local_3c0._20_4_ = auVar137._20_4_ + auVar137._20_4_;
    local_3c0._24_4_ = auVar137._24_4_ + auVar137._24_4_;
    fVar210 = auVar137._28_4_;
    local_3c0._28_4_ = fVar210 + fVar210;
    auVar12 = vsubps_avx(auVar162,auVar48);
    auVar123 = ZEXT1632(auVar257);
    auVar49._28_4_ = fVar210;
    auVar49._0_28_ =
         ZEXT1628(CONCAT412(fVar189 * fVar189,
                            CONCAT48(fVar188 * fVar188,CONCAT44(fVar170 * fVar170,fVar151 * fVar151)
                                    )));
    auVar137 = vsubps_avx(local_260,auVar49);
    auVar268 = ZEXT3264(auVar137);
    auVar50._4_4_ = fVar293 * fVar293;
    auVar50._0_4_ = fVar229 * fVar229;
    auVar50._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar50._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar50._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar50._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar50._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar50._28_4_ = auVar162._28_4_;
    fVar210 = auVar137._0_4_;
    local_2a0 = fVar210 * 4.0;
    fVar230 = auVar137._4_4_;
    fStack_29c = fVar230 * 4.0;
    fVar231 = auVar137._8_4_;
    fStack_298 = fVar231 * 4.0;
    fVar232 = auVar137._12_4_;
    fStack_294 = fVar232 * 4.0;
    fVar233 = auVar137._16_4_;
    fStack_290 = fVar233 * 4.0;
    fVar151 = auVar137._20_4_;
    fStack_28c = fVar151 * 4.0;
    fVar170 = auVar137._24_4_;
    fStack_288 = fVar170 * 4.0;
    uStack_284 = 0x40800000;
    auVar51._4_4_ = auVar12._4_4_ * fStack_29c;
    auVar51._0_4_ = auVar12._0_4_ * local_2a0;
    auVar51._8_4_ = auVar12._8_4_ * fStack_298;
    auVar51._12_4_ = auVar12._12_4_ * fStack_294;
    auVar51._16_4_ = auVar12._16_4_ * fStack_290;
    auVar51._20_4_ = auVar12._20_4_ * fStack_28c;
    auVar51._24_4_ = auVar12._24_4_ * fStack_288;
    auVar51._28_4_ = 0x40800000;
    auVar13 = vsubps_avx(auVar50,auVar51);
    auVar124 = vcmpps_avx(auVar13,auVar129,5);
    auVar288 = ZEXT3264(local_740);
    local_9a0 = vandps_avx(local_740,auVar49);
    local_8e0._0_4_ = fVar210 + fVar210;
    local_8e0._4_4_ = fVar230 + fVar230;
    local_8e0._8_4_ = fVar231 + fVar231;
    local_8e0._12_4_ = fVar232 + fVar232;
    local_8e0._16_4_ = fVar233 + fVar233;
    local_8e0._20_4_ = fVar151 + fVar151;
    local_8e0._24_4_ = fVar170 + fVar170;
    local_8e0._28_4_ = auVar137._28_4_ + auVar137._28_4_;
    local_8c0 = vandps_avx(auVar137,local_740);
    auVar137 = ZEXT1632(auVar113);
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      fStack_978 = INFINITY;
      local_980 = (undefined1  [8])0x7f8000007f800000;
      fStack_974 = INFINITY;
      uStack_970 = 0x7f800000;
      uStack_96c = 0x7f800000;
      uStack_968 = 0x7f800000;
      uStack_964 = 0x7f800000;
      auVar130._8_4_ = 0xff800000;
      auVar130._0_8_ = 0xff800000ff800000;
      auVar130._12_4_ = 0xff800000;
      auVar130._16_4_ = 0xff800000;
      auVar130._20_4_ = 0xff800000;
      auVar130._24_4_ = 0xff800000;
      auVar130._28_4_ = 0xff800000;
    }
    else {
      auVar158 = vsqrtps_avx(auVar13);
      auVar157 = vrcpps_avx(local_8e0);
      auVar13 = vcmpps_avx(auVar13,auVar129,5);
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = 0x3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar131._16_4_ = 0x3f800000;
      auVar131._20_4_ = 0x3f800000;
      auVar131._24_4_ = 0x3f800000;
      auVar131._28_4_ = 0x3f800000;
      auVar257 = vfnmadd213ps_fma(auVar157,local_8e0,auVar131);
      auVar257 = vfmadd132ps_fma(ZEXT1632(auVar257),auVar157,auVar157);
      auVar286._0_8_ = CONCAT44(fVar293,fVar229) ^ 0x8000000080000000;
      auVar286._8_4_ = -local_3c0._8_4_;
      auVar286._12_4_ = -local_3c0._12_4_;
      auVar286._16_4_ = -local_3c0._16_4_;
      auVar286._20_4_ = -local_3c0._20_4_;
      auVar286._24_4_ = -local_3c0._24_4_;
      auVar286._28_4_ = -local_3c0._28_4_;
      auVar129 = vsubps_avx(auVar286,auVar158);
      auVar52._4_4_ = auVar129._4_4_ * auVar257._4_4_;
      auVar52._0_4_ = auVar129._0_4_ * auVar257._0_4_;
      auVar52._8_4_ = auVar129._8_4_ * auVar257._8_4_;
      auVar52._12_4_ = auVar129._12_4_ * auVar257._12_4_;
      auVar52._16_4_ = auVar129._16_4_ * 0.0;
      auVar52._20_4_ = auVar129._20_4_ * 0.0;
      auVar52._24_4_ = auVar129._24_4_ * 0.0;
      auVar52._28_4_ = auVar129._28_4_;
      auVar288 = ZEXT3264(auVar52);
      auVar129 = vsubps_avx(auVar158,local_3c0);
      auVar53._4_4_ = auVar257._4_4_ * auVar129._4_4_;
      auVar53._0_4_ = auVar257._0_4_ * auVar129._0_4_;
      auVar53._8_4_ = auVar257._8_4_ * auVar129._8_4_;
      auVar53._12_4_ = auVar257._12_4_ * auVar129._12_4_;
      auVar53._16_4_ = auVar129._16_4_ * 0.0;
      auVar53._20_4_ = auVar129._20_4_ * 0.0;
      auVar53._24_4_ = auVar129._24_4_ * 0.0;
      auVar53._28_4_ = auVar129._28_4_;
      auVar257 = vfmadd213ps_fma(auVar123,auVar52,auVar137);
      local_3a0 = fVar227 * auVar257._0_4_;
      fStack_39c = fVar228 * auVar257._4_4_;
      fStack_398 = fVar289 * auVar257._8_4_;
      fStack_394 = fVar294 * auVar257._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 0x3f800000;
      auVar257 = vfmadd213ps_fma(auVar123,auVar53,auVar137);
      auVar268 = ZEXT1664(auVar257);
      local_380 = fVar227 * auVar257._0_4_;
      fStack_37c = fVar228 * auVar257._4_4_;
      fStack_378 = fVar289 * auVar257._8_4_;
      fStack_374 = fVar294 * auVar257._12_4_;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x3f800000;
      auVar132._8_4_ = 0x7f800000;
      auVar132._0_8_ = 0x7f8000007f800000;
      auVar132._12_4_ = 0x7f800000;
      auVar132._16_4_ = 0x7f800000;
      auVar132._20_4_ = 0x7f800000;
      auVar132._24_4_ = 0x7f800000;
      auVar132._28_4_ = 0x7f800000;
      _local_980 = vblendvps_avx(auVar132,auVar52,auVar13);
      auVar133._8_4_ = 0xff800000;
      auVar133._0_8_ = 0xff800000ff800000;
      auVar133._12_4_ = 0xff800000;
      auVar133._16_4_ = 0xff800000;
      auVar133._20_4_ = 0xff800000;
      auVar133._24_4_ = 0xff800000;
      auVar133._28_4_ = 0xff800000;
      auVar130 = vblendvps_avx(auVar133,auVar53,auVar13);
      auVar129 = vmaxps_avx(local_560,local_9a0);
      auVar54._4_4_ = auVar129._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar129._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar129._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar129._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar129._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar129._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar129._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar129._28_4_;
      auVar129 = vcmpps_avx(local_8c0,auVar54,1);
      auVar157 = auVar13 & auVar129;
      if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar157 >> 0x7f,0) != '\0') ||
            (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar157 >> 0xbf,0) != '\0') ||
          (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar157[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar129,auVar13);
        auVar129 = vcmpps_avx(auVar12,_DAT_01f7b000,2);
        auVar300._8_4_ = 0xff800000;
        auVar300._0_8_ = 0xff800000ff800000;
        auVar300._12_4_ = 0xff800000;
        auVar300._16_4_ = 0xff800000;
        auVar300._20_4_ = 0xff800000;
        auVar300._24_4_ = 0xff800000;
        auVar300._28_4_ = 0xff800000;
        auVar145._8_4_ = 0x7f800000;
        auVar145._0_8_ = 0x7f8000007f800000;
        auVar145._12_4_ = 0x7f800000;
        auVar145._16_4_ = 0x7f800000;
        auVar145._20_4_ = 0x7f800000;
        auVar145._24_4_ = 0x7f800000;
        auVar145._28_4_ = 0x7f800000;
        auVar12 = vblendvps_avx(auVar145,auVar300,auVar129);
        auVar257 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar157 = vpmovsxwd_avx2(auVar257);
        auVar268 = ZEXT3264(auVar157);
        _local_980 = vblendvps_avx(_local_980,auVar12,auVar157);
        auVar12 = vblendvps_avx(auVar300,auVar145,auVar129);
        auVar288 = ZEXT3264(auVar12);
        auVar130 = vblendvps_avx(auVar130,auVar12,auVar157);
        auVar209._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
        auVar209._8_4_ = auVar124._8_4_ ^ 0xffffffff;
        auVar209._12_4_ = auVar124._12_4_ ^ 0xffffffff;
        auVar209._16_4_ = auVar124._16_4_ ^ 0xffffffff;
        auVar209._20_4_ = auVar124._20_4_ ^ 0xffffffff;
        auVar209._24_4_ = auVar124._24_4_ ^ 0xffffffff;
        auVar209._28_4_ = auVar124._28_4_ ^ 0xffffffff;
        auVar124 = vorps_avx(auVar129,auVar209);
        auVar124 = vandps_avx(auVar13,auVar124);
      }
    }
    auVar12 = local_780 & auVar124;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      fVar210 = (ray->org).field_0.m128[3] - (float)local_860._0_4_;
      auVar207._4_4_ = fVar210;
      auVar207._0_4_ = fVar210;
      auVar207._8_4_ = fVar210;
      auVar207._12_4_ = fVar210;
      auVar207._16_4_ = fVar210;
      auVar207._20_4_ = fVar210;
      auVar207._24_4_ = fVar210;
      auVar207._28_4_ = fVar210;
      auVar13 = vmaxps_avx(auVar207,_local_980);
      fVar210 = ray->tfar - (float)local_860._0_4_;
      auVar224._4_4_ = fVar210;
      auVar224._0_4_ = fVar210;
      auVar224._8_4_ = fVar210;
      auVar224._12_4_ = fVar210;
      auVar224._16_4_ = fVar210;
      auVar224._20_4_ = fVar210;
      auVar224._24_4_ = fVar210;
      auVar224._28_4_ = fVar210;
      auVar129 = vminps_avx(auVar224,auVar130);
      auVar55._4_4_ = fVar302 * fVar108;
      auVar55._0_4_ = fVar280 * fVar298;
      auVar55._8_4_ = fVar303 * fVar146;
      auVar55._12_4_ = fVar304 * fVar147;
      auVar55._16_4_ = fVar305 * fVar148;
      auVar55._20_4_ = fVar306 * fVar149;
      auVar55._24_4_ = fVar307 * fVar150;
      auVar55._28_4_ = fVar210;
      auVar257 = vfmadd213ps_fma(auVar128,local_7c0,auVar55);
      auVar113 = vfmadd213ps_fma(auVar249,local_920,ZEXT1632(auVar257));
      auVar56._4_4_ = fVar302 * fStack_71c;
      auVar56._0_4_ = fVar280 * local_720;
      auVar56._8_4_ = fVar303 * fStack_718;
      auVar56._12_4_ = fVar304 * fStack_714;
      auVar56._16_4_ = fVar305 * fStack_710;
      auVar56._20_4_ = fVar306 * fStack_70c;
      auVar56._24_4_ = fVar307 * fStack_708;
      auVar56._28_4_ = auVar168._28_4_;
      auVar257 = vfmadd231ps_fma(auVar56,local_620,local_7c0);
      auVar290 = vfmadd231ps_fma(ZEXT1632(auVar257),_local_640,local_920);
      auVar168 = vandps_avx(ZEXT1632(auVar290),local_740);
      auVar252._8_4_ = 0x219392ef;
      auVar252._0_8_ = 0x219392ef219392ef;
      auVar252._12_4_ = 0x219392ef;
      auVar252._16_4_ = 0x219392ef;
      auVar252._20_4_ = 0x219392ef;
      auVar252._24_4_ = 0x219392ef;
      auVar252._28_4_ = 0x219392ef;
      auVar12 = vcmpps_avx(auVar168,auVar252,1);
      auVar168 = vrcpps_avx(ZEXT1632(auVar290));
      auVar295._8_4_ = 0x3f800000;
      auVar295._0_8_ = 0x3f8000003f800000;
      auVar295._12_4_ = 0x3f800000;
      auVar295._16_4_ = 0x3f800000;
      auVar295._20_4_ = 0x3f800000;
      auVar295._24_4_ = 0x3f800000;
      auVar295._28_4_ = 0x3f800000;
      auVar249 = ZEXT1632(auVar290);
      auVar257 = vfnmadd213ps_fma(auVar168,auVar249,auVar295);
      auVar257 = vfmadd132ps_fma(ZEXT1632(auVar257),auVar168,auVar168);
      auVar296._0_8_ = auVar290._0_8_ ^ 0x8000000080000000;
      auVar296._8_4_ = auVar290._8_4_ ^ 0x80000000;
      auVar296._12_4_ = auVar290._12_4_ ^ 0x80000000;
      auVar296._16_4_ = 0x80000000;
      auVar296._20_4_ = 0x80000000;
      auVar296._24_4_ = 0x80000000;
      auVar296._28_4_ = 0x80000000;
      auVar57._4_4_ = auVar257._4_4_ * -auVar113._4_4_;
      auVar57._0_4_ = auVar257._0_4_ * -auVar113._0_4_;
      auVar57._8_4_ = auVar257._8_4_ * -auVar113._8_4_;
      auVar57._12_4_ = auVar257._12_4_ * -auVar113._12_4_;
      auVar57._16_4_ = 0x80000000;
      auVar57._20_4_ = 0x80000000;
      auVar57._24_4_ = 0x80000000;
      auVar57._28_4_ = 0x80000000;
      auVar168 = vcmpps_avx(auVar249,auVar296,1);
      auVar168 = vorps_avx(auVar12,auVar168);
      auVar287._8_4_ = 0xff800000;
      auVar287._0_8_ = 0xff800000ff800000;
      auVar287._12_4_ = 0xff800000;
      auVar287._16_4_ = 0xff800000;
      auVar287._20_4_ = 0xff800000;
      auVar287._24_4_ = 0xff800000;
      auVar287._28_4_ = 0xff800000;
      auVar168 = vblendvps_avx(auVar57,auVar287,auVar168);
      auVar128 = vmaxps_avx(auVar13,auVar168);
      auVar168 = vcmpps_avx(auVar249,auVar296,6);
      auVar168 = vorps_avx(auVar12,auVar168);
      auVar297._8_4_ = 0x7f800000;
      auVar297._0_8_ = 0x7f8000007f800000;
      auVar297._12_4_ = 0x7f800000;
      auVar297._16_4_ = 0x7f800000;
      auVar297._20_4_ = 0x7f800000;
      auVar297._24_4_ = 0x7f800000;
      auVar297._28_4_ = 0x7f800000;
      auVar168 = vblendvps_avx(auVar57,auVar297,auVar168);
      auVar249 = vminps_avx(auVar129,auVar168);
      fVar210 = -local_a40._0_4_;
      fVar229 = -local_a40._4_4_;
      fVar293 = -local_a40._8_4_;
      fVar230 = -local_a40._12_4_;
      fVar231 = -local_a40._16_4_;
      fVar232 = -local_a40._20_4_;
      fVar233 = -local_a40._24_4_;
      auVar253._0_8_ = local_960._0_8_ ^ 0x8000000080000000;
      auVar253._8_4_ = -local_960._8_4_;
      auVar253._12_4_ = -local_960._12_4_;
      auVar253._16_4_ = -local_960._16_4_;
      auVar253._20_4_ = -local_960._20_4_;
      auVar253._24_4_ = -local_960._24_4_;
      auVar253._28_4_ = local_960._28_4_ ^ 0x80000000;
      auVar113 = ZEXT816(0) << 0x40;
      auVar168 = vsubps_avx(ZEXT1632(auVar113),local_a20);
      auVar12 = vsubps_avx(ZEXT1632(auVar113),local_7a0);
      auVar58._4_4_ = auVar12._4_4_ * fVar229;
      auVar58._0_4_ = auVar12._0_4_ * fVar210;
      auVar58._8_4_ = auVar12._8_4_ * fVar293;
      auVar58._12_4_ = auVar12._12_4_ * fVar230;
      auVar58._16_4_ = auVar12._16_4_ * fVar231;
      auVar58._20_4_ = auVar12._20_4_ * fVar232;
      auVar58._24_4_ = auVar12._24_4_ * fVar233;
      auVar58._28_4_ = auVar12._28_4_;
      auVar257 = vfmadd231ps_fma(auVar58,auVar253,auVar168);
      auVar262._0_8_ = local_ac0._0_8_ ^ 0x8000000080000000;
      auVar262._8_4_ = -local_ac0._8_4_;
      auVar262._12_4_ = -local_ac0._12_4_;
      auVar262._16_4_ = -local_ac0._16_4_;
      auVar262._20_4_ = -local_ac0._20_4_;
      auVar262._24_4_ = -local_ac0._24_4_;
      auVar262._28_4_ = local_ac0._28_4_ ^ 0x80000000;
      auVar168 = vsubps_avx(ZEXT1632(auVar113),local_a00);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar262,auVar168);
      auVar59._4_4_ = fVar229 * fStack_71c;
      auVar59._0_4_ = fVar210 * local_720;
      auVar59._8_4_ = fVar293 * fStack_718;
      auVar59._12_4_ = fVar230 * fStack_714;
      auVar59._16_4_ = fVar231 * fStack_710;
      auVar59._20_4_ = fVar232 * fStack_70c;
      auVar59._24_4_ = fVar233 * fStack_708;
      auVar59._28_4_ = local_a40._28_4_ ^ 0x80000000;
      auVar257 = vfmadd231ps_fma(auVar59,local_620,auVar253);
      auVar290 = vfmadd231ps_fma(ZEXT1632(auVar257),_local_640,auVar262);
      auVar168 = vandps_avx(ZEXT1632(auVar290),local_740);
      auVar13 = vrcpps_avx(ZEXT1632(auVar290));
      auVar134._8_4_ = 0x219392ef;
      auVar134._0_8_ = 0x219392ef219392ef;
      auVar134._12_4_ = 0x219392ef;
      auVar134._16_4_ = 0x219392ef;
      auVar134._20_4_ = 0x219392ef;
      auVar134._24_4_ = 0x219392ef;
      auVar134._28_4_ = 0x219392ef;
      auVar12 = vcmpps_avx(auVar168,auVar134,1);
      auVar255 = ZEXT3264(auVar12);
      auVar135._8_4_ = 0x3f800000;
      auVar135._0_8_ = 0x3f8000003f800000;
      auVar135._12_4_ = 0x3f800000;
      auVar135._16_4_ = 0x3f800000;
      auVar135._20_4_ = 0x3f800000;
      auVar135._24_4_ = 0x3f800000;
      auVar135._28_4_ = 0x3f800000;
      auVar129 = ZEXT1632(auVar290);
      auVar257 = vfnmadd213ps_fma(auVar13,auVar129,auVar135);
      auVar257 = vfmadd132ps_fma(ZEXT1632(auVar257),auVar13,auVar13);
      auVar263._0_8_ = auVar290._0_8_ ^ 0x8000000080000000;
      auVar263._8_4_ = auVar290._8_4_ ^ 0x80000000;
      auVar263._12_4_ = auVar290._12_4_ ^ 0x80000000;
      auVar263._16_4_ = 0x80000000;
      auVar263._20_4_ = 0x80000000;
      auVar263._24_4_ = 0x80000000;
      auVar263._28_4_ = 0x80000000;
      auVar60._4_4_ = auVar257._4_4_ * -auVar113._4_4_;
      auVar60._0_4_ = auVar257._0_4_ * -auVar113._0_4_;
      auVar60._8_4_ = auVar257._8_4_ * -auVar113._8_4_;
      auVar60._12_4_ = auVar257._12_4_ * -auVar113._12_4_;
      auVar60._16_4_ = 0x80000000;
      auVar60._20_4_ = 0x80000000;
      auVar60._24_4_ = 0x80000000;
      auVar60._28_4_ = 0x80000000;
      auVar268 = ZEXT3264(auVar60);
      auVar168 = vcmpps_avx(auVar129,auVar263,1);
      auVar168 = vorps_avx(auVar168,auVar12);
      auVar136._8_4_ = 0xff800000;
      auVar136._0_8_ = 0xff800000ff800000;
      auVar136._12_4_ = 0xff800000;
      auVar136._16_4_ = 0xff800000;
      auVar136._20_4_ = 0xff800000;
      auVar136._24_4_ = 0xff800000;
      auVar136._28_4_ = 0xff800000;
      auVar168 = vblendvps_avx(auVar60,auVar136,auVar168);
      _local_760 = vmaxps_avx(auVar128,auVar168);
      auVar288 = ZEXT3264(_local_760);
      auVar168 = vcmpps_avx(auVar129,auVar263,6);
      auVar168 = vorps_avx(auVar12,auVar168);
      auVar168 = vblendvps_avx(auVar60,auVar297,auVar168);
      auVar124 = vandps_avx(auVar124,local_780);
      local_5c0 = vminps_avx(auVar249,auVar168);
      auVar168 = vcmpps_avx(_local_760,local_5c0,2);
      auVar12 = auVar124 & auVar168;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar90._4_4_ = fStack_39c;
        auVar90._0_4_ = local_3a0;
        auVar90._8_4_ = fStack_398;
        auVar90._12_4_ = fStack_394;
        auVar90._16_4_ = uStack_390;
        auVar90._20_4_ = uStack_38c;
        auVar90._24_4_ = uStack_388;
        auVar90._28_4_ = uStack_384;
        auVar161._8_4_ = 0x3f800000;
        auVar161._0_8_ = 0x3f8000003f800000;
        auVar161._12_4_ = 0x3f800000;
        auVar161._16_4_ = 0x3f800000;
        auVar161._20_4_ = 0x3f800000;
        auVar161._24_4_ = 0x3f800000;
        auVar161._28_4_ = 0x3f800000;
        auVar12 = vminps_avx(auVar90,auVar161);
        auVar288 = ZEXT864(0) << 0x20;
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        auVar91._4_4_ = fStack_37c;
        auVar91._0_4_ = local_380;
        auVar91._8_4_ = fStack_378;
        auVar91._12_4_ = fStack_374;
        auVar91._16_4_ = uStack_370;
        auVar91._20_4_ = uStack_36c;
        auVar91._24_4_ = uStack_368;
        auVar91._28_4_ = uStack_364;
        auVar128 = vminps_avx(auVar91,auVar161);
        auVar128 = vmaxps_avx(auVar128,ZEXT832(0) << 0x20);
        auVar61._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
        auVar61._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
        auVar61._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
        auVar61._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
        auVar61._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
        auVar61._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
        auVar61._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
        auVar61._28_4_ = auVar12._28_4_ + 7.0;
        auVar257 = vfmadd213ps_fma(auVar61,local_800,local_7e0);
        auVar62._4_4_ = (auVar128._4_4_ + 1.0) * 0.125;
        auVar62._0_4_ = (auVar128._0_4_ + 0.0) * 0.125;
        auVar62._8_4_ = (auVar128._8_4_ + 2.0) * 0.125;
        auVar62._12_4_ = (auVar128._12_4_ + 3.0) * 0.125;
        auVar62._16_4_ = (auVar128._16_4_ + 4.0) * 0.125;
        auVar62._20_4_ = (auVar128._20_4_ + 5.0) * 0.125;
        auVar62._24_4_ = (auVar128._24_4_ + 6.0) * 0.125;
        auVar62._28_4_ = auVar128._28_4_ + 7.0;
        auVar113 = vfmadd213ps_fma(auVar62,local_800,local_7e0);
        auVar249 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar12 = vminps_avx(auVar122,auVar223);
        auVar128 = vminps_avx(auVar14,auVar15);
        auVar12 = vminps_avx(auVar12,auVar128);
        auVar12 = vsubps_avx(auVar12,local_2c0);
        auVar124 = vandps_avx(auVar168,auVar124);
        local_1a0 = ZEXT1632(auVar257);
        local_1c0 = ZEXT1632(auVar113);
        auVar63._4_4_ = auVar12._4_4_ * 0.99999976;
        auVar63._0_4_ = auVar12._0_4_ * 0.99999976;
        auVar63._8_4_ = auVar12._8_4_ * 0.99999976;
        auVar63._12_4_ = auVar12._12_4_ * 0.99999976;
        auVar63._16_4_ = auVar12._16_4_ * 0.99999976;
        auVar63._20_4_ = auVar12._20_4_ * 0.99999976;
        auVar63._24_4_ = auVar12._24_4_ * 0.99999976;
        auVar63._28_4_ = auVar12._28_4_;
        auVar168 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar63);
        auVar64._4_4_ = auVar168._4_4_ * auVar168._4_4_;
        auVar64._0_4_ = auVar168._0_4_ * auVar168._0_4_;
        auVar64._8_4_ = auVar168._8_4_ * auVar168._8_4_;
        auVar64._12_4_ = auVar168._12_4_ * auVar168._12_4_;
        auVar64._16_4_ = auVar168._16_4_ * auVar168._16_4_;
        auVar64._20_4_ = auVar168._20_4_ * auVar168._20_4_;
        auVar64._24_4_ = auVar168._24_4_ * auVar168._24_4_;
        auVar64._28_4_ = auVar168._28_4_;
        auVar12 = vsubps_avx(auVar162,auVar64);
        auVar65._4_4_ = auVar12._4_4_ * fStack_29c;
        auVar65._0_4_ = auVar12._0_4_ * local_2a0;
        auVar65._8_4_ = auVar12._8_4_ * fStack_298;
        auVar65._12_4_ = auVar12._12_4_ * fStack_294;
        auVar65._16_4_ = auVar12._16_4_ * fStack_290;
        auVar65._20_4_ = auVar12._20_4_ * fStack_28c;
        auVar65._24_4_ = auVar12._24_4_ * fStack_288;
        auVar65._28_4_ = auVar168._28_4_;
        auVar168 = vsubps_avx(auVar50,auVar65);
        local_b00 = vcmpps_avx(auVar168,ZEXT832(0) << 0x20,5);
        if ((((((((local_b00 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_b00 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_b00 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_b00 >> 0x7f,0) == '\0') &&
              (local_b00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_b00 >> 0xbf,0) == '\0') &&
            (local_b00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_b00[0x1f]) {
          auVar259 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar137 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar162 = ZEXT832(0) << 0x20;
          auVar241 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar267._8_4_ = 0x7f800000;
          auVar267._0_8_ = 0x7f8000007f800000;
          auVar267._12_4_ = 0x7f800000;
          auVar267._16_4_ = 0x7f800000;
          auVar267._20_4_ = 0x7f800000;
          auVar267._24_4_ = 0x7f800000;
          auVar267._28_4_ = 0x7f800000;
          auVar278._8_4_ = 0xff800000;
          auVar278._0_8_ = 0xff800000ff800000;
          auVar278._12_4_ = 0xff800000;
          auVar278._16_4_ = 0xff800000;
          auVar278._20_4_ = 0xff800000;
          auVar278._24_4_ = 0xff800000;
          auVar278._28_4_ = 0xff800000;
        }
        else {
          auVar249 = vrcpps_avx(local_8e0);
          auVar163._8_4_ = 0x3f800000;
          auVar163._0_8_ = 0x3f8000003f800000;
          auVar163._12_4_ = 0x3f800000;
          auVar163._16_4_ = 0x3f800000;
          auVar163._20_4_ = 0x3f800000;
          auVar163._24_4_ = 0x3f800000;
          auVar163._28_4_ = 0x3f800000;
          auVar257 = vfnmadd213ps_fma(local_8e0,auVar249,auVar163);
          auVar162 = vsqrtps_avx(auVar168);
          auVar257 = vfmadd132ps_fma(ZEXT1632(auVar257),auVar249,auVar249);
          auVar250._0_8_ = local_3c0._0_8_ ^ 0x8000000080000000;
          auVar250._8_4_ = -local_3c0._8_4_;
          auVar250._12_4_ = -local_3c0._12_4_;
          auVar250._16_4_ = -local_3c0._16_4_;
          auVar250._20_4_ = -local_3c0._20_4_;
          auVar250._24_4_ = -local_3c0._24_4_;
          auVar250._28_4_ = -local_3c0._28_4_;
          auVar249 = vsubps_avx(auVar250,auVar162);
          auVar162 = vsubps_avx(auVar162,local_3c0);
          fVar210 = auVar249._0_4_ * auVar257._0_4_;
          fVar229 = auVar249._4_4_ * auVar257._4_4_;
          auVar66._4_4_ = fVar229;
          auVar66._0_4_ = fVar210;
          fVar293 = auVar249._8_4_ * auVar257._8_4_;
          auVar66._8_4_ = fVar293;
          fVar230 = auVar249._12_4_ * auVar257._12_4_;
          auVar66._12_4_ = fVar230;
          fVar231 = auVar249._16_4_ * 0.0;
          auVar66._16_4_ = fVar231;
          fVar232 = auVar249._20_4_ * 0.0;
          auVar66._20_4_ = fVar232;
          fVar233 = auVar249._24_4_ * 0.0;
          auVar66._24_4_ = fVar233;
          auVar66._28_4_ = auVar249._28_4_;
          fVar298 = auVar162._0_4_ * auVar257._0_4_;
          fVar108 = auVar162._4_4_ * auVar257._4_4_;
          auVar67._4_4_ = fVar108;
          auVar67._0_4_ = fVar298;
          fVar146 = auVar162._8_4_ * auVar257._8_4_;
          auVar67._8_4_ = fVar146;
          fVar147 = auVar162._12_4_ * auVar257._12_4_;
          auVar67._12_4_ = fVar147;
          fVar148 = auVar162._16_4_ * 0.0;
          auVar67._16_4_ = fVar148;
          fVar149 = auVar162._20_4_ * 0.0;
          auVar67._20_4_ = fVar149;
          fVar150 = auVar162._24_4_ * 0.0;
          auVar67._24_4_ = fVar150;
          auVar67._28_4_ = local_800._0_4_;
          auVar257 = vfmadd213ps_fma(auVar123,auVar66,auVar137);
          auVar113 = vfmadd213ps_fma(auVar123,auVar67,auVar137);
          auVar249 = ZEXT1632(CONCAT412(fVar294 * auVar257._12_4_,
                                        CONCAT48(fVar289 * auVar257._8_4_,
                                                 CONCAT44(fVar228 * auVar257._4_4_,
                                                          fVar227 * auVar257._0_4_))));
          auVar68._28_4_ = auVar128._28_4_;
          auVar68._0_28_ =
               ZEXT1628(CONCAT412(fVar294 * auVar113._12_4_,
                                  CONCAT48(fVar289 * auVar113._8_4_,
                                           CONCAT44(fVar228 * auVar113._4_4_,
                                                    fVar227 * auVar113._0_4_))));
          auVar257 = vfmadd213ps_fma(local_300,auVar249,auVar126);
          auVar113 = vfmadd213ps_fma(local_300,auVar68,auVar126);
          auVar290 = vfmadd213ps_fma(local_320,auVar249,local_340);
          auVar299 = vfmadd213ps_fma(local_320,auVar68,local_340);
          auVar291 = vfmadd213ps_fma(auVar249,local_2e0,local_ae0);
          auVar240 = vfmadd213ps_fma(local_2e0,auVar68,local_ae0);
          auVar69._4_4_ = (float)local_640._4_4_ * fVar229;
          auVar69._0_4_ = (float)local_640._0_4_ * fVar210;
          auVar69._8_4_ = fStack_638 * fVar293;
          auVar69._12_4_ = fStack_634 * fVar230;
          auVar69._16_4_ = fStack_630 * fVar231;
          auVar69._20_4_ = fStack_62c * fVar232;
          auVar69._24_4_ = fStack_628 * fVar233;
          auVar69._28_4_ = 0;
          auVar137 = vsubps_avx(auVar69,ZEXT1632(auVar257));
          auVar70._4_4_ = local_620._4_4_ * fVar229;
          auVar70._0_4_ = local_620._0_4_ * fVar210;
          auVar70._8_4_ = local_620._8_4_ * fVar293;
          auVar70._12_4_ = local_620._12_4_ * fVar230;
          auVar70._16_4_ = local_620._16_4_ * fVar231;
          auVar70._20_4_ = local_620._20_4_ * fVar232;
          auVar70._24_4_ = local_620._24_4_ * fVar233;
          auVar70._28_4_ = local_3c0._28_4_;
          auVar162 = vsubps_avx(auVar70,ZEXT1632(auVar290));
          auVar182._0_4_ = local_720 * fVar210;
          auVar182._4_4_ = fStack_71c * fVar229;
          auVar182._8_4_ = fStack_718 * fVar293;
          auVar182._12_4_ = fStack_714 * fVar230;
          auVar182._16_4_ = fStack_710 * fVar231;
          auVar182._20_4_ = fStack_70c * fVar232;
          auVar182._24_4_ = fStack_708 * fVar233;
          auVar182._28_4_ = 0;
          auVar13 = vsubps_avx(auVar182,ZEXT1632(auVar291));
          auVar71._4_4_ = (float)local_640._4_4_ * fVar108;
          auVar71._0_4_ = (float)local_640._0_4_ * fVar298;
          auVar71._8_4_ = fStack_638 * fVar146;
          auVar71._12_4_ = fStack_634 * fVar147;
          auVar71._16_4_ = fStack_630 * fVar148;
          auVar71._20_4_ = fStack_62c * fVar149;
          auVar71._24_4_ = fStack_628 * fVar150;
          auVar71._28_4_ = auVar13._28_4_;
          auVar128 = vsubps_avx(auVar71,ZEXT1632(auVar113));
          auVar288 = ZEXT3264(auVar128);
          auVar72._4_4_ = local_620._4_4_ * fVar108;
          auVar72._0_4_ = local_620._0_4_ * fVar298;
          auVar72._8_4_ = local_620._8_4_ * fVar146;
          auVar72._12_4_ = local_620._12_4_ * fVar147;
          auVar72._16_4_ = local_620._16_4_ * fVar148;
          auVar72._20_4_ = local_620._20_4_ * fVar149;
          auVar72._24_4_ = local_620._24_4_ * fVar150;
          auVar72._28_4_ = auVar13._28_4_;
          auVar249 = vsubps_avx(auVar72,ZEXT1632(auVar299));
          auVar264._0_4_ = local_720 * fVar298;
          auVar264._4_4_ = fStack_71c * fVar108;
          auVar264._8_4_ = fStack_718 * fVar146;
          auVar264._12_4_ = fStack_714 * fVar147;
          auVar264._16_4_ = fStack_710 * fVar148;
          auVar264._20_4_ = fStack_70c * fVar149;
          auVar264._24_4_ = fStack_708 * fVar150;
          auVar264._28_4_ = 0;
          auVar128 = vsubps_avx(auVar264,ZEXT1632(auVar240));
          auVar259 = auVar128._0_28_;
          auVar168 = vcmpps_avx(auVar168,_DAT_01f7b000,5);
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar267 = vblendvps_avx(auVar242,auVar66,auVar168);
          auVar128 = vmaxps_avx(local_560,local_9a0);
          auVar73._4_4_ = auVar128._4_4_ * 1.9073486e-06;
          auVar73._0_4_ = auVar128._0_4_ * 1.9073486e-06;
          auVar73._8_4_ = auVar128._8_4_ * 1.9073486e-06;
          auVar73._12_4_ = auVar128._12_4_ * 1.9073486e-06;
          auVar73._16_4_ = auVar128._16_4_ * 1.9073486e-06;
          auVar73._20_4_ = auVar128._20_4_ * 1.9073486e-06;
          auVar73._24_4_ = auVar128._24_4_ * 1.9073486e-06;
          auVar73._28_4_ = auVar128._28_4_;
          auVar128 = vcmpps_avx(local_8c0,auVar73,1);
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          auVar278 = vblendvps_avx(auVar243,auVar67,auVar168);
          auVar14 = auVar168 & auVar128;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar128 = vandps_avx(auVar168,auVar128);
            auVar14 = vcmpps_avx(auVar12,_DAT_01f7b000,2);
            auVar284._8_4_ = 0xff800000;
            auVar284._0_8_ = 0xff800000ff800000;
            auVar284._12_4_ = 0xff800000;
            auVar284._16_4_ = 0xff800000;
            auVar284._20_4_ = 0xff800000;
            auVar284._24_4_ = 0xff800000;
            auVar284._28_4_ = 0xff800000;
            auVar301._8_4_ = 0x7f800000;
            auVar301._0_8_ = 0x7f8000007f800000;
            auVar301._12_4_ = 0x7f800000;
            auVar301._16_4_ = 0x7f800000;
            auVar301._20_4_ = 0x7f800000;
            auVar301._24_4_ = 0x7f800000;
            auVar301._28_4_ = 0x7f800000;
            auVar12 = vblendvps_avx(auVar301,auVar284,auVar14);
            auVar257 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
            auVar15 = vpmovsxwd_avx2(auVar257);
            auVar267 = vblendvps_avx(auVar267,auVar12,auVar15);
            auVar12 = vblendvps_avx(auVar284,auVar301,auVar14);
            auVar278 = vblendvps_avx(auVar278,auVar12,auVar15);
            auVar245._0_8_ = auVar128._0_8_ ^ 0xffffffffffffffff;
            auVar245._8_4_ = auVar128._8_4_ ^ 0xffffffff;
            auVar245._12_4_ = auVar128._12_4_ ^ 0xffffffff;
            auVar245._16_4_ = auVar128._16_4_ ^ 0xffffffff;
            auVar245._20_4_ = auVar128._20_4_ ^ 0xffffffff;
            auVar245._24_4_ = auVar128._24_4_ ^ 0xffffffff;
            auVar245._28_4_ = auVar128._28_4_ ^ 0xffffffff;
            auVar12 = vorps_avx(auVar14,auVar245);
            local_b00 = vandps_avx(auVar168,auVar12);
          }
          auVar241 = auVar13._0_28_;
        }
        uVar109 = *(undefined4 *)&(ray->dir).field_0;
        auVar283._4_4_ = uVar109;
        auVar283._0_4_ = uVar109;
        auVar283._8_4_ = uVar109;
        auVar283._12_4_ = uVar109;
        auVar283._16_4_ = uVar109;
        auVar283._20_4_ = uVar109;
        auVar283._24_4_ = uVar109;
        auVar283._28_4_ = uVar109;
        auVar285 = ZEXT3264(auVar283);
        uVar109 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar254._4_4_ = uVar109;
        auVar254._0_4_ = uVar109;
        auVar254._8_4_ = uVar109;
        auVar254._12_4_ = uVar109;
        auVar254._16_4_ = uVar109;
        auVar254._20_4_ = uVar109;
        auVar254._24_4_ = uVar109;
        auVar254._28_4_ = uVar109;
        auVar255 = ZEXT3264(auVar254);
        fVar210 = (ray->dir).field_0.m128[2];
        local_5a0 = _local_760;
        local_580 = vminps_avx(local_5c0,auVar267);
        local_820 = vmaxps_avx(_local_760,auVar278);
        auVar279 = ZEXT3264(local_820);
        _local_5e0 = local_820;
        auVar168 = vcmpps_avx(_local_760,local_580,2);
        local_660 = vandps_avx(auVar168,auVar124);
        auVar268 = ZEXT3264(local_660);
        auVar168 = vcmpps_avx(local_820,local_5c0,2);
        local_940 = vandps_avx(auVar168,auVar124);
        auVar226 = ZEXT3264(local_940);
        auVar124 = vorps_avx(local_660,local_940);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          auVar74._4_4_ = auVar259._4_4_ * fVar210;
          auVar74._0_4_ = auVar259._0_4_ * fVar210;
          auVar74._8_4_ = auVar259._8_4_ * fVar210;
          auVar74._12_4_ = auVar259._12_4_ * fVar210;
          auVar74._16_4_ = auVar259._16_4_ * fVar210;
          auVar74._20_4_ = auVar259._20_4_ * fVar210;
          auVar74._24_4_ = auVar259._24_4_ * fVar210;
          auVar74._28_4_ = auVar124._28_4_;
          auVar257 = vfmadd213ps_fma(auVar249,auVar254,auVar74);
          auVar75._4_4_ = fVar210 * auVar241._4_4_;
          auVar75._0_4_ = fVar210 * auVar241._0_4_;
          auVar75._8_4_ = fVar210 * auVar241._8_4_;
          auVar75._12_4_ = fVar210 * auVar241._12_4_;
          auVar75._16_4_ = fVar210 * auVar241._16_4_;
          auVar75._20_4_ = fVar210 * auVar241._20_4_;
          auVar75._24_4_ = fVar210 * auVar241._24_4_;
          auVar75._28_4_ = auVar124._28_4_;
          auVar113 = vfmadd213ps_fma(auVar162,auVar254,auVar75);
          auVar257 = vfmadd213ps_fma(auVar288._0_32_,auVar283,ZEXT1632(auVar257));
          auVar288 = ZEXT1664(auVar257);
          auVar183._0_8_ = local_b00._0_8_ ^ 0xffffffffffffffff;
          auVar183._8_4_ = local_b00._8_4_ ^ 0xffffffff;
          auVar183._12_4_ = local_b00._12_4_ ^ 0xffffffff;
          auVar183._16_4_ = local_b00._16_4_ ^ 0xffffffff;
          auVar183._20_4_ = local_b00._20_4_ ^ 0xffffffff;
          auVar183._24_4_ = local_b00._24_4_ ^ 0xffffffff;
          auVar183._28_4_ = local_b00._28_4_ ^ 0xffffffff;
          auVar124 = vandps_avx(ZEXT1632(auVar257),local_740);
          auVar244._8_4_ = 0x3e99999a;
          auVar244._0_8_ = 0x3e99999a3e99999a;
          auVar244._12_4_ = 0x3e99999a;
          auVar244._16_4_ = 0x3e99999a;
          auVar244._20_4_ = 0x3e99999a;
          auVar244._24_4_ = 0x3e99999a;
          auVar244._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar244,1);
          local_6a0 = vorps_avx(auVar124,auVar183);
          auVar257 = vfmadd213ps_fma(auVar137,auVar283,ZEXT1632(auVar113));
          auVar124 = vandps_avx(ZEXT1632(auVar257),local_740);
          auVar124 = vcmpps_avx(auVar124,auVar244,1);
          auVar124 = vorps_avx(auVar124,auVar183);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar184,auVar164,auVar124);
          local_6c0._4_4_ = local_b44;
          local_6c0._0_4_ = local_b44;
          local_6c0._8_4_ = local_b44;
          local_6c0._12_4_ = local_b44;
          local_6c0._16_4_ = local_b44;
          local_6c0._20_4_ = local_b44;
          local_6c0._24_4_ = local_b44;
          local_6c0._28_4_ = local_b44;
          local_680 = vpcmpgtd_avx2(auVar124,local_6c0);
          auVar124 = vpandn_avx2(local_680,local_660);
          local_840._4_4_ = local_760._4_4_ + (float)local_700._4_4_;
          local_840._0_4_ = local_760._0_4_ + (float)local_700._0_4_;
          fStack_838 = local_760._8_4_ + fStack_6f8;
          fStack_834 = local_760._12_4_ + fStack_6f4;
          fStack_830 = local_760._16_4_ + fStack_6f0;
          fStack_82c = local_760._20_4_ + fStack_6ec;
          fStack_828 = local_760._24_4_ + fStack_6e8;
          fStack_824 = local_760._28_4_ + fStack_6e4;
          while( true ) {
            local_3e0 = auVar124;
            if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar124 >> 0x7f,0) == '\0') &&
                  (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar124 >> 0xbf,0) == '\0') &&
                (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar124[0x1f]) break;
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar168 = vblendvps_avx(auVar165,_local_760,auVar124);
            auVar12 = vshufps_avx(auVar168,auVar168,0xb1);
            auVar12 = vminps_avx(auVar168,auVar12);
            auVar128 = vshufpd_avx(auVar12,auVar12,5);
            auVar12 = vminps_avx(auVar12,auVar128);
            auVar128 = vpermpd_avx2(auVar12,0x4e);
            auVar12 = vminps_avx(auVar12,auVar128);
            auVar168 = vcmpps_avx(auVar168,auVar12,0);
            auVar12 = auVar124 & auVar168;
            if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0x7f,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0xbf,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar12[0x1f] < '\0') {
              auVar124 = vandps_avx(auVar168,auVar124);
            }
            uVar98 = vmovmskps_avx(auVar124);
            iVar16 = 0;
            for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            uVar100 = (ulong)(uint)(iVar16 << 2);
            *(undefined4 *)(local_3e0 + uVar100) = 0;
            aVar2 = (ray->dir).field_0;
            local_b00._0_16_ = (undefined1  [16])aVar2;
            auVar257 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar98 = *(uint *)(local_1a0 + uVar100);
            if (auVar257._0_4_ < 0.0) {
              local_ae0._0_16_ = ZEXT416(*(uint *)(local_5a0 + uVar100));
              auVar285 = ZEXT1664(auVar285._0_16_);
              auVar288 = ZEXT1664(auVar288._0_16_);
              fVar210 = sqrtf(auVar257._0_4_);
              auVar226 = ZEXT3264(local_940);
              uVar100 = extraout_RAX;
              auVar257 = local_ae0._0_16_;
            }
            else {
              auVar257 = vsqrtss_avx(auVar257,auVar257);
              fVar210 = auVar257._0_4_;
              auVar257 = ZEXT416(*(uint *)(local_5a0 + uVar100));
            }
            auVar255 = ZEXT464(uVar98);
            auVar290 = vminps_avx(local_880._0_16_,local_a80);
            auVar113 = vmaxps_avx(local_880._0_16_,local_a80);
            auVar299 = vminps_avx(local_8a0._0_16_,_local_a90);
            auVar291 = vminps_avx(auVar290,auVar299);
            auVar290 = vmaxps_avx(local_8a0._0_16_,_local_a90);
            auVar299 = vmaxps_avx(auVar113,auVar290);
            local_920._8_4_ = 0x7fffffff;
            local_920._0_8_ = 0x7fffffff7fffffff;
            local_920._12_4_ = 0x7fffffff;
            auVar113 = vandps_avx(auVar291,local_920._0_16_);
            auVar290 = vandps_avx(auVar299,local_920._0_16_);
            auVar113 = vmaxps_avx(auVar113,auVar290);
            auVar290 = vmovshdup_avx(auVar113);
            auVar290 = vmaxss_avx(auVar290,auVar113);
            auVar113 = vshufpd_avx(auVar113,auVar113,1);
            auVar113 = vmaxss_avx(auVar113,auVar290);
            local_900 = auVar113._0_4_ * 1.9073486e-06;
            local_7c0._0_4_ = fVar210 * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar299,auVar299,0xff);
            auVar257 = vinsertps_avx(auVar257,ZEXT416(uVar98),0x10);
            auVar268 = ZEXT1664(auVar257);
            uVar104 = 0;
            while( true ) {
              auVar257 = auVar268._0_16_;
              bVar97 = (byte)uVar100;
              if (uVar104 == 5) break;
              local_a00._0_16_ = vmovshdup_avx(auVar257);
              fVar227 = local_a00._0_4_;
              fVar293 = 1.0 - fVar227;
              fVar229 = fVar293 * fVar293 * fVar293;
              fVar289 = fVar227 * fVar227;
              fVar228 = fVar227 * fVar289;
              auVar290 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar229),
                                         ZEXT416((uint)fVar228));
              fVar210 = fVar227 * fVar293;
              auVar299 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar210 * 6.0)),
                                         ZEXT416((uint)(fVar293 * fVar210)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar291 = vfmadd231ss_fma(ZEXT416((uint)(fVar293 * fVar210 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar227 * fVar210)));
              auVar113 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar228),
                                         ZEXT416((uint)fVar229));
              fVar227 = (auVar113._0_4_ + auVar291._0_4_) * 0.16666667;
              fVar228 = fVar228 * 0.16666667;
              auVar153._0_4_ = fVar228 * (float)local_a90._0_4_;
              auVar153._4_4_ = fVar228 * (float)local_a90._4_4_;
              auVar153._8_4_ = fVar228 * fStack_a88;
              auVar153._12_4_ = fVar228 * fStack_a84;
              auVar192._4_4_ = fVar227;
              auVar192._0_4_ = fVar227;
              auVar192._8_4_ = fVar227;
              auVar192._12_4_ = fVar227;
              auVar113 = vfmadd132ps_fma(auVar192,auVar153,local_8a0._0_16_);
              fVar227 = (auVar290._0_4_ + auVar299._0_4_) * 0.16666667;
              auVar154._4_4_ = fVar227;
              auVar154._0_4_ = fVar227;
              auVar154._8_4_ = fVar227;
              auVar154._12_4_ = fVar227;
              auVar113 = vfmadd132ps_fma(auVar154,auVar113,local_a80);
              fVar227 = auVar268._0_4_;
              auVar172._4_4_ = fVar227;
              auVar172._0_4_ = fVar227;
              auVar172._8_4_ = fVar227;
              auVar172._12_4_ = fVar227;
              auVar290 = vfmadd213ps_fma(auVar172,local_b00._0_16_,_DAT_01f45a50);
              fVar229 = fVar229 * 0.16666667;
              auVar112._4_4_ = fVar229;
              auVar112._0_4_ = fVar229;
              auVar112._8_4_ = fVar229;
              auVar112._12_4_ = fVar229;
              auVar113 = vfmadd132ps_fma(auVar112,auVar113,local_880._0_16_);
              local_7a0._0_16_ = auVar113;
              auVar113 = vsubps_avx(auVar290,auVar113);
              _local_980 = auVar113;
              auVar113 = vdpps_avx(auVar113,auVar113,0x7f);
              local_ae0._0_16_ = auVar113;
              if (auVar113._0_4_ < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar293);
                local_ac0._0_4_ = fVar289;
                local_a40._0_4_ = fVar210;
                auVar285._0_4_ = sqrtf(auVar113._0_4_);
                auVar285._4_60_ = extraout_var;
                auVar113 = auVar285._0_16_;
                uVar100 = extraout_RAX_00;
                fVar289 = (float)local_ac0._0_4_;
                fVar210 = (float)local_a40._0_4_;
                auVar290 = local_a20._0_16_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                auVar290 = ZEXT416((uint)fVar293);
              }
              fVar228 = auVar290._0_4_;
              auVar114._4_4_ = fVar228;
              auVar114._0_4_ = fVar228;
              auVar114._8_4_ = fVar228;
              auVar114._12_4_ = fVar228;
              auVar291 = vfnmsub213ss_fma(local_a00._0_16_,local_a00._0_16_,
                                          ZEXT416((uint)(fVar210 * 4.0)));
              auVar299 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * 4.0)),auVar290,auVar290);
              fVar210 = fVar228 * -fVar228 * 0.5;
              fVar228 = auVar291._0_4_ * 0.5;
              fVar229 = auVar299._0_4_ * 0.5;
              fVar289 = fVar289 * 0.5;
              auVar236._0_4_ = (float)local_a90._0_4_ * fVar289;
              auVar236._4_4_ = (float)local_a90._4_4_ * fVar289;
              auVar236._8_4_ = fStack_a88 * fVar289;
              auVar236._12_4_ = fStack_a84 * fVar289;
              auVar193._4_4_ = fVar229;
              auVar193._0_4_ = fVar229;
              auVar193._8_4_ = fVar229;
              auVar193._12_4_ = fVar229;
              auVar299 = vfmadd213ps_fma(auVar193,local_8a0._0_16_,auVar236);
              auVar212._4_4_ = fVar228;
              auVar212._0_4_ = fVar228;
              auVar212._8_4_ = fVar228;
              auVar212._12_4_ = fVar228;
              auVar299 = vfmadd213ps_fma(auVar212,local_a80,auVar299);
              auVar275._4_4_ = fVar210;
              auVar275._0_4_ = fVar210;
              auVar275._8_4_ = fVar210;
              auVar275._12_4_ = fVar210;
              auVar240 = vfmadd213ps_fma(auVar275,local_880._0_16_,auVar299);
              auVar299 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar290,local_a00._0_16_);
              auVar291 = vfmadd213ss_fma(local_a00._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar290);
              auVar290 = vshufps_avx(auVar257,auVar257,0x55);
              auVar194._0_4_ = (float)local_a90._0_4_ * auVar290._0_4_;
              auVar194._4_4_ = (float)local_a90._4_4_ * auVar290._4_4_;
              auVar194._8_4_ = fStack_a88 * auVar290._8_4_;
              auVar194._12_4_ = fStack_a84 * auVar290._12_4_;
              uVar109 = auVar291._0_4_;
              auVar213._4_4_ = uVar109;
              auVar213._0_4_ = uVar109;
              auVar213._8_4_ = uVar109;
              auVar213._12_4_ = uVar109;
              auVar290 = vfmadd213ps_fma(auVar213,local_8a0._0_16_,auVar194);
              auVar173._0_4_ = auVar299._0_4_;
              auVar173._4_4_ = auVar173._0_4_;
              auVar173._8_4_ = auVar173._0_4_;
              auVar173._12_4_ = auVar173._0_4_;
              auVar290 = vfmadd213ps_fma(auVar173,local_a80,auVar290);
              auVar4 = vfmadd231ps_fma(auVar290,local_880._0_16_,auVar114);
              auVar299 = vdpps_avx(auVar240,auVar240,0x7f);
              auVar290 = vblendps_avx(auVar299,_DAT_01f45a50,0xe);
              auVar291 = vrsqrtss_avx(auVar290,auVar290);
              fVar210 = auVar291._0_4_;
              fVar229 = auVar299._0_4_;
              fVar210 = fVar210 * 1.5 + fVar229 * -0.5 * fVar210 * fVar210 * fVar210;
              auVar291 = vdpps_avx(auVar240,auVar4,0x7f);
              auVar174._0_4_ = auVar4._0_4_ * fVar229;
              auVar174._4_4_ = auVar4._4_4_ * fVar229;
              auVar174._8_4_ = auVar4._8_4_ * fVar229;
              auVar174._12_4_ = auVar4._12_4_ * fVar229;
              fVar228 = auVar291._0_4_;
              auVar237._0_4_ = auVar240._0_4_ * fVar228;
              auVar237._4_4_ = auVar240._4_4_ * fVar228;
              fVar289 = auVar240._8_4_;
              auVar237._8_4_ = fVar289 * fVar228;
              fVar293 = auVar240._12_4_;
              auVar237._12_4_ = fVar293 * fVar228;
              auVar291 = vsubps_avx(auVar174,auVar237);
              auVar290 = vrcpss_avx(auVar290,auVar290);
              auVar4 = vfnmadd213ss_fma(auVar290,auVar299,ZEXT416(0x40000000));
              fVar228 = auVar290._0_4_ * auVar4._0_4_;
              auVar290 = vmaxss_avx(ZEXT416((uint)local_900),
                                    ZEXT416((uint)(fVar227 * (float)local_7c0._0_4_)));
              auVar288 = ZEXT1664(auVar290);
              auVar246._0_8_ = auVar240._0_8_ ^ 0x8000000080000000;
              auVar246._8_4_ = -fVar289;
              auVar246._12_4_ = -fVar293;
              auVar195._0_4_ = fVar210 * auVar291._0_4_ * fVar228;
              auVar195._4_4_ = fVar210 * auVar291._4_4_ * fVar228;
              auVar195._8_4_ = fVar210 * auVar291._8_4_ * fVar228;
              auVar195._12_4_ = fVar210 * auVar291._12_4_ * fVar228;
              auVar258._0_4_ = auVar240._0_4_ * fVar210;
              auVar258._4_4_ = auVar240._4_4_ * fVar210;
              auVar258._8_4_ = fVar289 * fVar210;
              auVar258._12_4_ = fVar293 * fVar210;
              local_a00._0_16_ = auVar240;
              local_a20._0_4_ = auVar290._0_4_;
              if (fVar229 < -fVar229) {
                local_ac0._0_4_ = auVar113._0_4_;
                local_a40._0_16_ = auVar246;
                local_960._0_16_ = auVar258;
                local_9a0._0_16_ = auVar195;
                fVar210 = sqrtf(fVar229);
                auVar288 = ZEXT464((uint)local_a20._0_4_);
                auVar113 = ZEXT416((uint)local_ac0._0_4_);
                uVar100 = extraout_RAX_01;
                auVar195 = local_9a0._0_16_;
                auVar246 = local_a40._0_16_;
                auVar258 = local_960._0_16_;
              }
              else {
                auVar290 = vsqrtss_avx(auVar299,auVar299);
                fVar210 = auVar290._0_4_;
              }
              auVar290 = vdpps_avx(_local_980,auVar258,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_900),auVar113,auVar288._0_16_);
              auVar299 = vdpps_avx(auVar246,auVar258,0x7f);
              auVar291 = vdpps_avx(_local_980,auVar195,0x7f);
              auVar240 = vdpps_avx(local_b00._0_16_,auVar258,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)(auVar113._0_4_ + 1.0)),
                                       ZEXT416((uint)(local_900 / fVar210)),auVar4);
              auVar285 = ZEXT1664(auVar4);
              fVar210 = auVar299._0_4_ + auVar291._0_4_;
              auVar115._0_4_ = auVar290._0_4_ * auVar290._0_4_;
              auVar115._4_4_ = auVar290._4_4_ * auVar290._4_4_;
              auVar115._8_4_ = auVar290._8_4_ * auVar290._8_4_;
              auVar115._12_4_ = auVar290._12_4_ * auVar290._12_4_;
              auVar113 = vdpps_avx(_local_980,auVar246,0x7f);
              auVar291 = vsubps_avx(local_ae0._0_16_,auVar115);
              auVar299 = vrsqrtss_avx(auVar291,auVar291);
              fVar228 = auVar291._0_4_;
              fVar227 = auVar299._0_4_;
              fVar227 = fVar227 * 1.5 + fVar228 * -0.5 * fVar227 * fVar227 * fVar227;
              auVar299 = vdpps_avx(_local_980,local_b00._0_16_,0x7f);
              auVar113 = vfnmadd231ss_fma(auVar113,auVar290,ZEXT416((uint)fVar210));
              auVar299 = vfnmadd231ss_fma(auVar299,auVar290,auVar240);
              if (fVar228 < 0.0) {
                local_ac0._0_16_ = auVar290;
                local_a40._0_4_ = auVar4._0_4_;
                local_960._0_16_ = ZEXT416((uint)fVar210);
                local_9a0._0_16_ = auVar240;
                local_8c0._0_16_ = auVar113;
                local_8e0._0_4_ = fVar227;
                local_7e0._0_16_ = auVar299;
                fVar228 = sqrtf(fVar228);
                auVar285 = ZEXT464((uint)local_a40._0_4_);
                auVar288 = ZEXT464((uint)local_a20._0_4_);
                uVar100 = extraout_RAX_02;
                fVar227 = (float)local_8e0._0_4_;
                auVar299 = local_7e0._0_16_;
                auVar113 = local_8c0._0_16_;
                auVar290 = local_ac0._0_16_;
                auVar240 = local_9a0._0_16_;
                auVar291 = local_960._0_16_;
              }
              else {
                auVar291 = vsqrtss_avx(auVar291,auVar291);
                fVar228 = auVar291._0_4_;
                auVar291 = ZEXT416((uint)fVar210);
              }
              auVar255 = ZEXT1664(local_ae0._0_16_);
              auVar226 = ZEXT3264(local_940);
              auVar4 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar228 = fVar228 - auVar4._0_4_;
              auVar4 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              auVar113 = vfmsub213ss_fma(auVar113,ZEXT416((uint)fVar227),auVar4);
              auVar196._0_8_ = auVar240._0_8_ ^ 0x8000000080000000;
              auVar196._8_4_ = auVar240._8_4_ ^ 0x80000000;
              auVar196._12_4_ = auVar240._12_4_ ^ 0x80000000;
              auVar214._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
              auVar214._8_4_ = auVar113._8_4_ ^ 0x80000000;
              auVar214._12_4_ = auVar113._12_4_ ^ 0x80000000;
              auVar175 = ZEXT416((uint)(auVar299._0_4_ * fVar227));
              auVar299 = vfmsub231ss_fma(ZEXT416((uint)(auVar240._0_4_ * auVar113._0_4_)),auVar291,
                                         auVar175);
              auVar113 = vinsertps_avx(auVar214,auVar175,0x1c);
              uVar109 = auVar299._0_4_;
              auVar215._4_4_ = uVar109;
              auVar215._0_4_ = uVar109;
              auVar215._8_4_ = uVar109;
              auVar215._12_4_ = uVar109;
              auVar113 = vdivps_avx(auVar113,auVar215);
              auVar299 = vinsertps_avx(auVar291,auVar196,0x10);
              auVar299 = vdivps_avx(auVar299,auVar215);
              fVar210 = auVar290._0_4_;
              auVar176._0_4_ = fVar210 * auVar113._0_4_ + fVar228 * auVar299._0_4_;
              auVar176._4_4_ = fVar210 * auVar113._4_4_ + fVar228 * auVar299._4_4_;
              auVar176._8_4_ = fVar210 * auVar113._8_4_ + fVar228 * auVar299._8_4_;
              auVar176._12_4_ = fVar210 * auVar113._12_4_ + fVar228 * auVar299._12_4_;
              auVar113 = vsubps_avx(auVar257,auVar176);
              auVar268 = ZEXT1664(auVar113);
              auVar257 = vandps_avx(auVar290,local_920._0_16_);
              if (auVar257._0_4_ < auVar285._0_4_) {
                auVar290 = vfmadd231ss_fma(ZEXT416((uint)(auVar288._0_4_ + auVar285._0_4_)),
                                           local_800._0_16_,ZEXT416(0x36000000));
                auVar257 = vandps_avx(ZEXT416((uint)fVar228),local_920._0_16_);
                if (auVar257._0_4_ < auVar290._0_4_) {
                  bVar107 = uVar104 < 5;
                  fVar210 = auVar113._0_4_ + (float)local_860._0_4_;
                  bVar97 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar210) &&
                     (fVar227 = ray->tfar, fVar210 <= fVar227)) {
                    auVar257 = vmovshdup_avx(auVar113);
                    fVar228 = auVar257._0_4_;
                    bVar97 = 0;
                    if ((0.0 <= fVar228) && (bVar97 = 0, fVar228 <= 1.0)) {
                      auVar257 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                      fVar229 = auVar257._0_4_;
                      pGVar7 = (context->scene->geometries).items[uVar101].ptr;
                      if ((pGVar7->mask & ray->mask) == 0) {
                        bVar97 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar97 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar229 = fVar229 * 1.5 +
                                  local_ae0._0_4_ * -0.5 * fVar229 * fVar229 * fVar229;
                        auVar197._0_4_ = fVar229 * (float)local_980._0_4_;
                        auVar197._4_4_ = fVar229 * (float)local_980._4_4_;
                        auVar197._8_4_ = fVar229 * fStack_978;
                        auVar197._12_4_ = fVar229 * fStack_974;
                        auVar291 = vfmadd213ps_fma(auVar4,auVar197,local_a00._0_16_);
                        auVar257 = vshufps_avx(auVar197,auVar197,0xc9);
                        auVar290 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                        auVar198._0_4_ = auVar197._0_4_ * auVar290._0_4_;
                        auVar198._4_4_ = auVar197._4_4_ * auVar290._4_4_;
                        auVar198._8_4_ = auVar197._8_4_ * auVar290._8_4_;
                        auVar198._12_4_ = auVar197._12_4_ * auVar290._12_4_;
                        auVar299 = vfmsub231ps_fma(auVar198,local_a00._0_16_,auVar257);
                        auVar257 = vshufps_avx(auVar299,auVar299,0xc9);
                        auVar290 = vshufps_avx(auVar291,auVar291,0xc9);
                        auVar299 = vshufps_avx(auVar299,auVar299,0xd2);
                        auVar116._0_4_ = auVar291._0_4_ * auVar299._0_4_;
                        auVar116._4_4_ = auVar291._4_4_ * auVar299._4_4_;
                        auVar116._8_4_ = auVar291._8_4_ * auVar299._8_4_;
                        auVar116._12_4_ = auVar291._12_4_ * auVar299._12_4_;
                        auVar290 = vfmsub231ps_fma(auVar116,auVar257,auVar290);
                        auVar257 = vshufps_avx(auVar290,auVar290,0xe9);
                        local_9e0 = vmovlps_avx(auVar257);
                        local_9d8 = auVar290._0_4_;
                        local_9d0 = 0;
                        local_9cc = (undefined4)local_9a8;
                        local_9c4 = context->user->instID[0];
                        local_9c0 = context->user->instPrimID[0];
                        ray->tfar = fVar210;
                        local_6e0._0_4_ = 0xffffffff;
                        local_a70.valid = (int *)local_6e0;
                        local_a70.geometryUserPtr = pGVar7->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = (RTCHitN *)&local_9e0;
                        local_a70.N = 1;
                        local_a70.ray = (RTCRayN *)ray;
                        local_9d4 = fVar228;
                        local_9c8 = uVar101;
                        if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013f6756:
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar255 = ZEXT1664(auVar255._0_16_);
                            auVar268 = ZEXT1664(auVar268._0_16_);
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            auVar288 = ZEXT1664(auVar288._0_16_);
                            (*p_Var11)(&local_a70);
                            if (*local_a70.valid == 0) goto LAB_013f679e;
                          }
                          bVar97 = 1;
                        }
                        else {
                          auVar255 = ZEXT1664(local_ae0._0_16_);
                          auVar268 = ZEXT1664(auVar113);
                          auVar285 = ZEXT1664(auVar285._0_16_);
                          auVar288 = ZEXT1664(auVar288._0_16_);
                          (*pGVar7->occlusionFilterN)(&local_a70);
                          if (*local_a70.valid != 0) goto LAB_013f6756;
LAB_013f679e:
                          ray->tfar = fVar227;
                          bVar97 = 0;
                        }
                        auVar226 = ZEXT3264(local_940);
                      }
                    }
                  }
                  goto LAB_013f6556;
                }
              }
              uVar104 = uVar104 + 1;
            }
            bVar107 = false;
LAB_013f6556:
            fVar210 = ray->tfar;
            auVar138._4_4_ = fVar210;
            auVar138._0_4_ = fVar210;
            auVar138._8_4_ = fVar210;
            auVar138._12_4_ = fVar210;
            auVar138._16_4_ = fVar210;
            auVar138._20_4_ = fVar210;
            auVar138._24_4_ = fVar210;
            auVar138._28_4_ = fVar210;
            bVar106 = bVar106 | bVar107 & bVar97;
            auVar124 = vcmpps_avx(_local_840,auVar138,2);
            auVar124 = vandps_avx(auVar124,local_3e0);
            auVar279 = ZEXT3264(local_820);
          }
          auVar139._0_4_ = auVar279._0_4_ + (float)local_700._0_4_;
          auVar139._4_4_ = auVar279._4_4_ + (float)local_700._4_4_;
          auVar139._8_4_ = auVar279._8_4_ + fStack_6f8;
          auVar139._12_4_ = auVar279._12_4_ + fStack_6f4;
          auVar139._16_4_ = auVar279._16_4_ + fStack_6f0;
          auVar139._20_4_ = auVar279._20_4_ + fStack_6ec;
          auVar139._24_4_ = auVar279._24_4_ + fStack_6e8;
          auVar139._28_4_ = auVar279._28_4_ + fStack_6e4;
          fVar227 = ray->tfar;
          fVar210 = ray->tfar;
          auVar185._4_4_ = fVar210;
          auVar185._0_4_ = fVar210;
          auVar185._8_4_ = fVar210;
          auVar185._12_4_ = fVar210;
          auVar185._16_4_ = fVar210;
          auVar185._20_4_ = fVar210;
          auVar185._24_4_ = fVar210;
          auVar185._28_4_ = fVar210;
          auVar124 = vcmpps_avx(auVar139,auVar185,2);
          local_820 = vandps_avx(auVar124,auVar226._0_32_);
          auVar140._8_4_ = 3;
          auVar140._0_8_ = 0x300000003;
          auVar140._12_4_ = 3;
          auVar140._16_4_ = 3;
          auVar140._20_4_ = 3;
          auVar140._24_4_ = 3;
          auVar140._28_4_ = 3;
          auVar186._8_4_ = 2;
          auVar186._0_8_ = 0x200000002;
          auVar186._12_4_ = 2;
          auVar186._16_4_ = 2;
          auVar186._20_4_ = 2;
          auVar186._24_4_ = 2;
          auVar186._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar186,auVar140,local_6a0);
          _local_840 = vpcmpgtd_avx2(auVar124,local_6c0);
          local_6e0 = vpandn_avx2(_local_840,local_820);
          local_800 = _local_5e0;
          local_760._4_4_ = (float)local_700._4_4_ + (float)local_5e0._4_4_;
          local_760._0_4_ = (float)local_700._0_4_ + (float)local_5e0._0_4_;
          fStack_758 = fStack_6f8 + fStack_5d8;
          fStack_754 = fStack_6f4 + fStack_5d4;
          fStack_750 = fStack_6f0 + fStack_5d0;
          fStack_74c = fStack_6ec + fStack_5cc;
          fStack_748 = fStack_6e8 + fStack_5c8;
          fStack_744 = fStack_6e4 + fStack_5c4;
          while( true ) {
            if ((((((((local_6e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_6e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_6e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_6e0 >> 0x7f,0) == '\0') &&
                  (local_6e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_6e0 >> 0xbf,0) == '\0') &&
                (local_6e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_6e0[0x1f]) break;
            auVar166._8_4_ = 0x7f800000;
            auVar166._0_8_ = 0x7f8000007f800000;
            auVar166._12_4_ = 0x7f800000;
            auVar166._16_4_ = 0x7f800000;
            auVar166._20_4_ = 0x7f800000;
            auVar166._24_4_ = 0x7f800000;
            auVar166._28_4_ = 0x7f800000;
            auVar124 = vblendvps_avx(auVar166,local_800,local_6e0);
            auVar168 = vshufps_avx(auVar124,auVar124,0xb1);
            auVar168 = vminps_avx(auVar124,auVar168);
            auVar12 = vshufpd_avx(auVar168,auVar168,5);
            auVar168 = vminps_avx(auVar168,auVar12);
            auVar12 = vpermpd_avx2(auVar168,0x4e);
            auVar168 = vminps_avx(auVar168,auVar12);
            auVar168 = vcmpps_avx(auVar124,auVar168,0);
            auVar12 = local_6e0 & auVar168;
            auVar124 = local_6e0;
            if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0x7f,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar12 >> 0xbf,0) != '\0') ||
                (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar12[0x1f] < '\0') {
              auVar124 = vandps_avx(auVar168,local_6e0);
            }
            uVar98 = vmovmskps_avx(auVar124);
            iVar16 = 0;
            for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            uVar100 = (ulong)(uint)(iVar16 << 2);
            *(undefined4 *)(local_6e0 + uVar100) = 0;
            aVar2 = (ray->dir).field_0;
            local_b00._0_16_ = (undefined1  [16])aVar2;
            auVar257 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar98 = *(uint *)(local_1c0 + uVar100);
            auVar255 = ZEXT464(*(uint *)(local_5c0 + uVar100));
            if (auVar257._0_4_ < 0.0) {
              local_ae0._0_16_ = ZEXT416(*(uint *)(local_5c0 + uVar100));
              auVar268 = ZEXT1664(auVar268._0_16_);
              auVar285 = ZEXT1664(auVar285._0_16_);
              auVar288 = ZEXT1664(auVar288._0_16_);
              fVar210 = sqrtf(auVar257._0_4_);
              auVar255 = ZEXT1664(local_ae0._0_16_);
              uVar100 = extraout_RAX_03;
            }
            else {
              auVar257 = vsqrtss_avx(auVar257,auVar257);
              fVar210 = auVar257._0_4_;
            }
            auVar113 = vminps_avx(local_880._0_16_,local_a80);
            auVar257 = vmaxps_avx(local_880._0_16_,local_a80);
            auVar290 = vminps_avx(local_8a0._0_16_,_local_a90);
            auVar299 = vminps_avx(auVar113,auVar290);
            auVar113 = vmaxps_avx(local_8a0._0_16_,_local_a90);
            auVar290 = vmaxps_avx(auVar257,auVar113);
            local_7c0._8_4_ = NAN;
            local_7c0._0_8_ = 0x7fffffff7fffffff;
            local_7c0._12_4_ = NAN;
            auVar257 = vandps_avx(auVar299,local_7c0._0_16_);
            auVar113 = vandps_avx(auVar290,local_7c0._0_16_);
            auVar257 = vmaxps_avx(auVar257,auVar113);
            auVar113 = vmovshdup_avx(auVar257);
            auVar113 = vmaxss_avx(auVar113,auVar257);
            auVar257 = vshufpd_avx(auVar257,auVar257,1);
            auVar257 = vmaxss_avx(auVar257,auVar113);
            local_900 = auVar257._0_4_ * 1.9073486e-06;
            local_940._0_4_ = fVar210 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar290,auVar290,0xff);
            auVar257 = vinsertps_avx(auVar255._0_16_,ZEXT416(uVar98),0x10);
            auVar279 = ZEXT1664(auVar257);
            uVar104 = 0;
            while( true ) {
              auVar257 = auVar279._0_16_;
              bVar97 = (byte)uVar100;
              if (uVar104 == 5) break;
              local_a00._0_16_ = vmovshdup_avx(auVar257);
              fVar227 = local_a00._0_4_;
              fVar293 = 1.0 - fVar227;
              fVar229 = fVar293 * fVar293 * fVar293;
              fVar289 = fVar227 * fVar227;
              fVar228 = fVar227 * fVar289;
              auVar290 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar229),
                                         ZEXT416((uint)fVar228));
              fVar210 = fVar227 * fVar293;
              auVar299 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * fVar210 * 6.0)),
                                         ZEXT416((uint)(fVar293 * fVar210)),
                                         SUB6416(ZEXT464(0x41400000),0));
              auVar291 = vfmadd231ss_fma(ZEXT416((uint)(fVar293 * fVar210 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar227 * fVar210)));
              auVar113 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar228),
                                         ZEXT416((uint)fVar229));
              fVar227 = (auVar113._0_4_ + auVar291._0_4_) * 0.16666667;
              fVar228 = fVar228 * 0.16666667;
              auVar155._0_4_ = fVar228 * (float)local_a90._0_4_;
              auVar155._4_4_ = fVar228 * (float)local_a90._4_4_;
              auVar155._8_4_ = fVar228 * fStack_a88;
              auVar155._12_4_ = fVar228 * fStack_a84;
              auVar199._4_4_ = fVar227;
              auVar199._0_4_ = fVar227;
              auVar199._8_4_ = fVar227;
              auVar199._12_4_ = fVar227;
              auVar113 = vfmadd132ps_fma(auVar199,auVar155,local_8a0._0_16_);
              fVar227 = (auVar290._0_4_ + auVar299._0_4_) * 0.16666667;
              auVar156._4_4_ = fVar227;
              auVar156._0_4_ = fVar227;
              auVar156._8_4_ = fVar227;
              auVar156._12_4_ = fVar227;
              auVar113 = vfmadd132ps_fma(auVar156,auVar113,local_a80);
              fVar227 = auVar279._0_4_;
              auVar177._4_4_ = fVar227;
              auVar177._0_4_ = fVar227;
              auVar177._8_4_ = fVar227;
              auVar177._12_4_ = fVar227;
              auVar290 = vfmadd213ps_fma(auVar177,local_b00._0_16_,_DAT_01f45a50);
              fVar229 = fVar229 * 0.16666667;
              auVar117._4_4_ = fVar229;
              auVar117._0_4_ = fVar229;
              auVar117._8_4_ = fVar229;
              auVar117._12_4_ = fVar229;
              auVar113 = vfmadd132ps_fma(auVar117,auVar113,local_880._0_16_);
              local_7a0._0_16_ = auVar113;
              auVar113 = vsubps_avx(auVar290,auVar113);
              _local_980 = auVar113;
              auVar113 = vdpps_avx(auVar113,auVar113,0x7f);
              local_ae0._0_16_ = auVar113;
              if (auVar113._0_4_ < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar293);
                local_920._0_4_ = fVar289;
                local_ac0._0_4_ = fVar210;
                auVar279._0_4_ = sqrtf(auVar113._0_4_);
                auVar279._4_60_ = extraout_var_00;
                auVar113 = auVar279._0_16_;
                uVar100 = extraout_RAX_04;
                fVar289 = (float)local_920._0_4_;
                fVar210 = (float)local_ac0._0_4_;
                auVar290 = local_a20._0_16_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                auVar290 = ZEXT416((uint)fVar293);
              }
              fVar228 = auVar290._0_4_;
              auVar118._4_4_ = fVar228;
              auVar118._0_4_ = fVar228;
              auVar118._8_4_ = fVar228;
              auVar118._12_4_ = fVar228;
              auVar291 = vfnmsub213ss_fma(local_a00._0_16_,local_a00._0_16_,
                                          ZEXT416((uint)(fVar210 * 4.0)));
              auVar299 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * 4.0)),auVar290,auVar290);
              fVar210 = fVar228 * -fVar228 * 0.5;
              fVar228 = auVar291._0_4_ * 0.5;
              fVar229 = auVar299._0_4_ * 0.5;
              fVar289 = fVar289 * 0.5;
              auVar238._0_4_ = (float)local_a90._0_4_ * fVar289;
              auVar238._4_4_ = (float)local_a90._4_4_ * fVar289;
              auVar238._8_4_ = fStack_a88 * fVar289;
              auVar238._12_4_ = fStack_a84 * fVar289;
              auVar200._4_4_ = fVar229;
              auVar200._0_4_ = fVar229;
              auVar200._8_4_ = fVar229;
              auVar200._12_4_ = fVar229;
              auVar299 = vfmadd213ps_fma(auVar200,local_8a0._0_16_,auVar238);
              auVar216._4_4_ = fVar228;
              auVar216._0_4_ = fVar228;
              auVar216._8_4_ = fVar228;
              auVar216._12_4_ = fVar228;
              auVar299 = vfmadd213ps_fma(auVar216,local_a80,auVar299);
              auVar266._4_4_ = fVar210;
              auVar266._0_4_ = fVar210;
              auVar266._8_4_ = fVar210;
              auVar266._12_4_ = fVar210;
              auVar240 = vfmadd213ps_fma(auVar266,local_880._0_16_,auVar299);
              auVar299 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar290,local_a00._0_16_);
              auVar175 = vfmadd213ss_fma(local_a00._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar290);
              auVar288 = ZEXT1664(auVar175);
              auVar290 = vshufps_avx(auVar257,auVar257,0x55);
              auVar201._0_4_ = (float)local_a90._0_4_ * auVar290._0_4_;
              auVar201._4_4_ = (float)local_a90._4_4_ * auVar290._4_4_;
              auVar201._8_4_ = fStack_a88 * auVar290._8_4_;
              auVar201._12_4_ = fStack_a84 * auVar290._12_4_;
              uVar109 = auVar175._0_4_;
              auVar217._4_4_ = uVar109;
              auVar217._0_4_ = uVar109;
              auVar217._8_4_ = uVar109;
              auVar217._12_4_ = uVar109;
              auVar290 = vfmadd213ps_fma(auVar217,local_8a0._0_16_,auVar201);
              auVar178._0_4_ = auVar299._0_4_;
              auVar178._4_4_ = auVar178._0_4_;
              auVar178._8_4_ = auVar178._0_4_;
              auVar178._12_4_ = auVar178._0_4_;
              auVar290 = vfmadd213ps_fma(auVar178,local_a80,auVar290);
              auVar4 = vfmadd231ps_fma(auVar290,local_880._0_16_,auVar118);
              auVar299 = vdpps_avx(auVar240,auVar240,0x7f);
              auVar290 = vblendps_avx(auVar299,_DAT_01f45a50,0xe);
              auVar291 = vrsqrtss_avx(auVar290,auVar290);
              fVar210 = auVar291._0_4_;
              fVar229 = auVar299._0_4_;
              fVar210 = fVar210 * 1.5 + fVar229 * -0.5 * fVar210 * fVar210 * fVar210;
              auVar291 = vdpps_avx(auVar240,auVar4,0x7f);
              auVar179._0_4_ = auVar4._0_4_ * fVar229;
              auVar179._4_4_ = auVar4._4_4_ * fVar229;
              auVar179._8_4_ = auVar4._8_4_ * fVar229;
              auVar179._12_4_ = auVar4._12_4_ * fVar229;
              fVar228 = auVar291._0_4_;
              auVar239._0_4_ = auVar240._0_4_ * fVar228;
              auVar239._4_4_ = auVar240._4_4_ * fVar228;
              fVar289 = auVar240._8_4_;
              auVar239._8_4_ = fVar289 * fVar228;
              fVar293 = auVar240._12_4_;
              auVar239._12_4_ = fVar293 * fVar228;
              auVar291 = vsubps_avx(auVar179,auVar239);
              auVar290 = vrcpss_avx(auVar290,auVar290);
              auVar4 = vfnmadd213ss_fma(auVar290,auVar299,ZEXT416(0x40000000));
              fVar228 = auVar290._0_4_ * auVar4._0_4_;
              auVar290 = vmaxss_avx(ZEXT416((uint)local_900),
                                    ZEXT416((uint)(fVar227 * (float)local_940._0_4_)));
              auVar226 = ZEXT1664(auVar290);
              auVar276._0_8_ = auVar240._0_8_ ^ 0x8000000080000000;
              auVar276._8_4_ = -fVar289;
              auVar276._12_4_ = -fVar293;
              auVar202._0_4_ = fVar210 * auVar291._0_4_ * fVar228;
              auVar202._4_4_ = fVar210 * auVar291._4_4_ * fVar228;
              auVar202._8_4_ = fVar210 * auVar291._8_4_ * fVar228;
              auVar202._12_4_ = fVar210 * auVar291._12_4_ * fVar228;
              auVar251._0_4_ = auVar240._0_4_ * fVar210;
              auVar251._4_4_ = auVar240._4_4_ * fVar210;
              auVar251._8_4_ = fVar289 * fVar210;
              auVar251._12_4_ = fVar293 * fVar210;
              local_a00._0_16_ = auVar240;
              local_a20._0_4_ = auVar290._0_4_;
              if (fVar229 < -fVar229) {
                local_920._0_4_ = auVar113._0_4_;
                local_ac0._0_16_ = auVar276;
                local_a40._0_16_ = auVar251;
                local_960._0_16_ = auVar202;
                auVar288 = ZEXT1664(auVar175);
                fVar210 = sqrtf(fVar229);
                auVar226 = ZEXT464((uint)local_a20._0_4_);
                auVar113 = ZEXT416((uint)local_920._0_4_);
                uVar100 = extraout_RAX_05;
                auVar202 = local_960._0_16_;
                auVar251 = local_a40._0_16_;
                auVar276 = local_ac0._0_16_;
              }
              else {
                auVar290 = vsqrtss_avx(auVar299,auVar299);
                fVar210 = auVar290._0_4_;
              }
              auVar290 = vdpps_avx(_local_980,auVar251,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)local_900),auVar113,auVar226._0_16_);
              auVar299 = vdpps_avx(auVar276,auVar251,0x7f);
              auVar291 = vdpps_avx(_local_980,auVar202,0x7f);
              auVar240 = vdpps_avx(local_b00._0_16_,auVar251,0x7f);
              auVar4 = vfmadd213ss_fma(ZEXT416((uint)(auVar113._0_4_ + 1.0)),
                                       ZEXT416((uint)(local_900 / fVar210)),auVar4);
              auVar285 = ZEXT1664(auVar4);
              fVar210 = auVar299._0_4_ + auVar291._0_4_;
              auVar119._0_4_ = auVar290._0_4_ * auVar290._0_4_;
              auVar119._4_4_ = auVar290._4_4_ * auVar290._4_4_;
              auVar119._8_4_ = auVar290._8_4_ * auVar290._8_4_;
              auVar119._12_4_ = auVar290._12_4_ * auVar290._12_4_;
              auVar113 = vdpps_avx(_local_980,auVar276,0x7f);
              auVar291 = vsubps_avx(local_ae0._0_16_,auVar119);
              auVar299 = vrsqrtss_avx(auVar291,auVar291);
              fVar228 = auVar291._0_4_;
              fVar227 = auVar299._0_4_;
              fVar227 = fVar227 * 1.5 + fVar228 * -0.5 * fVar227 * fVar227 * fVar227;
              auVar299 = vdpps_avx(_local_980,local_b00._0_16_,0x7f);
              local_920._0_16_ = vfnmadd231ss_fma(auVar113,auVar290,ZEXT416((uint)fVar210));
              auVar113 = vfnmadd231ss_fma(auVar299,auVar290,auVar240);
              if (fVar228 < 0.0) {
                local_ac0._0_16_ = auVar290;
                local_a40._0_4_ = auVar4._0_4_;
                local_960._0_16_ = ZEXT416((uint)fVar210);
                local_9a0._0_16_ = auVar240;
                local_8c0._0_4_ = fVar227;
                local_8e0._0_16_ = auVar113;
                auVar288 = ZEXT1664(auVar288._0_16_);
                fVar228 = sqrtf(fVar228);
                auVar285 = ZEXT464((uint)local_a40._0_4_);
                auVar226 = ZEXT464((uint)local_a20._0_4_);
                uVar100 = extraout_RAX_06;
                fVar227 = (float)local_8c0._0_4_;
                auVar113 = local_8e0._0_16_;
                auVar240 = local_9a0._0_16_;
                auVar290 = local_ac0._0_16_;
                auVar299 = local_960._0_16_;
              }
              else {
                auVar299 = vsqrtss_avx(auVar291,auVar291);
                fVar228 = auVar299._0_4_;
                auVar299 = ZEXT416((uint)fVar210);
              }
              auVar255 = ZEXT1664(local_a00._0_16_);
              auVar291 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar228 = fVar228 - auVar291._0_4_;
              auVar291 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xff);
              auVar4 = vfmsub213ss_fma(local_920._0_16_,ZEXT416((uint)fVar227),auVar291);
              auVar268 = ZEXT1664(auVar4);
              auVar203._0_8_ = auVar240._0_8_ ^ 0x8000000080000000;
              auVar203._8_4_ = auVar240._8_4_ ^ 0x80000000;
              auVar203._12_4_ = auVar240._12_4_ ^ 0x80000000;
              auVar218._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
              auVar218._8_4_ = auVar4._8_4_ ^ 0x80000000;
              auVar218._12_4_ = auVar4._12_4_ ^ 0x80000000;
              auVar113 = ZEXT416((uint)(auVar113._0_4_ * fVar227));
              auVar240 = vfmsub231ss_fma(ZEXT416((uint)(auVar4._0_4_ * auVar240._0_4_)),auVar299,
                                         auVar113);
              auVar113 = vinsertps_avx(auVar218,auVar113,0x1c);
              uVar109 = auVar240._0_4_;
              auVar219._4_4_ = uVar109;
              auVar219._0_4_ = uVar109;
              auVar219._8_4_ = uVar109;
              auVar219._12_4_ = uVar109;
              auVar113 = vdivps_avx(auVar113,auVar219);
              auVar299 = vinsertps_avx(auVar299,auVar203,0x10);
              auVar299 = vdivps_avx(auVar299,auVar219);
              fVar210 = auVar290._0_4_;
              auVar180._0_4_ = fVar210 * auVar113._0_4_ + fVar228 * auVar299._0_4_;
              auVar180._4_4_ = fVar210 * auVar113._4_4_ + fVar228 * auVar299._4_4_;
              auVar180._8_4_ = fVar210 * auVar113._8_4_ + fVar228 * auVar299._8_4_;
              auVar180._12_4_ = fVar210 * auVar113._12_4_ + fVar228 * auVar299._12_4_;
              auVar113 = vsubps_avx(auVar257,auVar180);
              auVar279 = ZEXT1664(auVar113);
              auVar257 = vandps_avx(auVar290,local_7c0._0_16_);
              if (auVar257._0_4_ < auVar285._0_4_) {
                auVar290 = vfmadd231ss_fma(ZEXT416((uint)(auVar226._0_4_ + auVar285._0_4_)),
                                           local_7e0._0_16_,ZEXT416(0x36000000));
                auVar257 = vandps_avx(ZEXT416((uint)fVar228),local_7c0._0_16_);
                if (auVar257._0_4_ < auVar290._0_4_) {
                  bVar107 = uVar104 < 5;
                  fVar210 = auVar113._0_4_ + (float)local_860._0_4_;
                  bVar97 = 0;
                  if ((fVar210 < (ray->org).field_0.m128[3]) ||
                     (fVar227 = ray->tfar, fVar227 < fVar210)) goto LAB_013f6ef6;
                  auVar257 = vmovshdup_avx(auVar113);
                  fVar228 = auVar257._0_4_;
                  bVar97 = 0;
                  if ((fVar228 < 0.0) || (bVar97 = 0, 1.0 < fVar228)) goto LAB_013f6ef6;
                  auVar257 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                  fVar229 = auVar257._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar101].ptr;
                  if ((pGVar7->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar97 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_013f6ef6;
                    fVar229 = fVar229 * 1.5 + local_ae0._0_4_ * -0.5 * fVar229 * fVar229 * fVar229;
                    auVar204._0_4_ = fVar229 * (float)local_980._0_4_;
                    auVar204._4_4_ = fVar229 * (float)local_980._4_4_;
                    auVar204._8_4_ = fVar229 * fStack_978;
                    auVar204._12_4_ = fVar229 * fStack_974;
                    auVar291 = vfmadd213ps_fma(auVar291,auVar204,local_a00._0_16_);
                    auVar257 = vshufps_avx(auVar204,auVar204,0xc9);
                    auVar290 = vshufps_avx(local_a00._0_16_,local_a00._0_16_,0xc9);
                    auVar205._0_4_ = auVar204._0_4_ * auVar290._0_4_;
                    auVar205._4_4_ = auVar204._4_4_ * auVar290._4_4_;
                    auVar205._8_4_ = auVar204._8_4_ * auVar290._8_4_;
                    auVar205._12_4_ = auVar204._12_4_ * auVar290._12_4_;
                    auVar299 = vfmsub231ps_fma(auVar205,local_a00._0_16_,auVar257);
                    auVar257 = vshufps_avx(auVar299,auVar299,0xc9);
                    auVar290 = vshufps_avx(auVar291,auVar291,0xc9);
                    auVar299 = vshufps_avx(auVar299,auVar299,0xd2);
                    auVar120._0_4_ = auVar291._0_4_ * auVar299._0_4_;
                    auVar120._4_4_ = auVar291._4_4_ * auVar299._4_4_;
                    auVar120._8_4_ = auVar291._8_4_ * auVar299._8_4_;
                    auVar120._12_4_ = auVar291._12_4_ * auVar299._12_4_;
                    auVar290 = vfmsub231ps_fma(auVar120,auVar257,auVar290);
                    auVar257 = vshufps_avx(auVar290,auVar290,0xe9);
                    local_9e0 = vmovlps_avx(auVar257);
                    local_9d8 = auVar290._0_4_;
                    local_9d0 = 0;
                    local_9cc = (undefined4)local_9a8;
                    local_9c4 = context->user->instID[0];
                    local_9c0 = context->user->instPrimID[0];
                    ray->tfar = fVar210;
                    local_b04 = -1;
                    local_a70.valid = &local_b04;
                    local_a70.geometryUserPtr = pGVar7->userPtr;
                    local_a70.context = context->user;
                    local_a70.hit = (RTCHitN *)&local_9e0;
                    local_a70.N = 1;
                    local_a70.ray = (RTCRayN *)ray;
                    local_9d4 = fVar228;
                    local_9c8 = uVar101;
                    if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013f70e3:
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar255 = ZEXT1664(auVar255._0_16_);
                        auVar268 = ZEXT1664(auVar268._0_16_);
                        auVar279 = ZEXT1664(auVar279._0_16_);
                        auVar285 = ZEXT1664(auVar285._0_16_);
                        auVar288 = ZEXT1664(auVar288._0_16_);
                        (*p_Var11)(&local_a70);
                        if (*local_a70.valid == 0) goto LAB_013f711f;
                      }
                      bVar97 = 1;
                      goto LAB_013f6ef6;
                    }
                    auVar255 = ZEXT1664(local_a00._0_16_);
                    auVar268 = ZEXT1664(auVar4);
                    auVar279 = ZEXT1664(auVar113);
                    auVar285 = ZEXT1664(auVar285._0_16_);
                    auVar288 = ZEXT1664(auVar288._0_16_);
                    (*pGVar7->occlusionFilterN)(&local_a70);
                    if (*local_a70.valid != 0) goto LAB_013f70e3;
LAB_013f711f:
                    ray->tfar = fVar227;
                  }
                  bVar97 = 0;
                  goto LAB_013f6ef6;
                }
              }
              uVar104 = uVar104 + 1;
            }
            bVar107 = false;
LAB_013f6ef6:
            bVar106 = bVar106 | bVar107 & bVar97;
            fVar210 = ray->tfar;
            auVar141._4_4_ = fVar210;
            auVar141._0_4_ = fVar210;
            auVar141._8_4_ = fVar210;
            auVar141._12_4_ = fVar210;
            auVar141._16_4_ = fVar210;
            auVar141._20_4_ = fVar210;
            auVar141._24_4_ = fVar210;
            auVar141._28_4_ = fVar210;
            fVar227 = ray->tfar;
            auVar124 = vcmpps_avx(_local_760,auVar141,2);
            local_6e0 = vandps_avx(auVar124,local_6e0);
          }
          auVar187._0_4_ = (float)local_700._0_4_ + local_5a0._0_4_;
          auVar187._4_4_ = (float)local_700._4_4_ + local_5a0._4_4_;
          auVar187._8_4_ = fStack_6f8 + local_5a0._8_4_;
          auVar187._12_4_ = fStack_6f4 + local_5a0._12_4_;
          auVar187._16_4_ = fStack_6f0 + local_5a0._16_4_;
          auVar187._20_4_ = fStack_6ec + local_5a0._20_4_;
          auVar187._24_4_ = fStack_6e8 + local_5a0._24_4_;
          auVar187._28_4_ = fStack_6e4 + local_5a0._28_4_;
          auVar208._4_4_ = fVar227;
          auVar208._0_4_ = fVar227;
          auVar208._8_4_ = fVar227;
          auVar208._12_4_ = fVar227;
          auVar208._16_4_ = fVar227;
          auVar208._20_4_ = fVar227;
          auVar208._24_4_ = fVar227;
          auVar208._28_4_ = fVar227;
          auVar168 = vcmpps_avx(auVar187,auVar208,2);
          auVar124 = vandps_avx(local_680,local_660);
          auVar124 = vandps_avx(auVar168,auVar124);
          auVar225._0_4_ = (float)local_700._0_4_ + local_5e0._0_4_;
          auVar225._4_4_ = (float)local_700._4_4_ + local_5e0._4_4_;
          auVar225._8_4_ = fStack_6f8 + local_5e0._8_4_;
          auVar225._12_4_ = fStack_6f4 + local_5e0._12_4_;
          auVar225._16_4_ = fStack_6f0 + local_5e0._16_4_;
          auVar225._20_4_ = fStack_6ec + local_5e0._20_4_;
          auVar225._24_4_ = fStack_6e8 + local_5e0._24_4_;
          auVar225._28_4_ = fStack_6e4 + local_5e0._28_4_;
          auVar12 = vcmpps_avx(auVar225,auVar208,2);
          auVar168 = vandps_avx(_local_840,local_820);
          auVar168 = vandps_avx(auVar12,auVar168);
          auVar168 = vorps_avx(auVar124,auVar168);
          if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar168 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar168 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar168 >> 0x7f,0) != '\0') ||
                (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar168 >> 0xbf,0) != '\0') ||
              (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar168[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar168;
            auVar124 = vblendvps_avx(_local_5e0,local_5a0,auVar124);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar124;
            uVar100 = vmovlps_avx(local_5f0);
            (&uStack_140)[uVar99 * 0xc] = uVar100;
            aiStack_138[uVar99 * 0x18] = local_b44 + 1;
            uVar99 = (ulong)((int)uVar99 + 1);
          }
        }
      }
    }
    fVar210 = ray->tfar;
    auVar142._4_4_ = fVar210;
    auVar142._0_4_ = fVar210;
    auVar142._8_4_ = fVar210;
    auVar142._12_4_ = fVar210;
    auVar142._16_4_ = fVar210;
    auVar142._20_4_ = fVar210;
    auVar142._24_4_ = fVar210;
    auVar142._28_4_ = fVar210;
    while( true ) {
      uVar98 = (uint)uVar99;
      if (uVar98 == 0) {
        if (bVar106 != 0) goto LAB_013f741a;
        auVar124 = vcmpps_avx(local_360,auVar142,2);
        uVar101 = vmovmskps_avx(auVar124);
        uVar101 = uVar101 & (uint)local_848 - 1 & (uint)local_848;
        goto LAB_013f4e97;
      }
      uVar99 = (ulong)(uVar98 - 1);
      lVar103 = uVar99 * 0x60;
      auVar124 = *(undefined1 (*) [32])(auStack_160 + lVar103);
      auVar167._0_4_ = auVar124._0_4_ + (float)local_700._0_4_;
      auVar167._4_4_ = auVar124._4_4_ + (float)local_700._4_4_;
      auVar167._8_4_ = auVar124._8_4_ + fStack_6f8;
      auVar167._12_4_ = auVar124._12_4_ + fStack_6f4;
      auVar167._16_4_ = auVar124._16_4_ + fStack_6f0;
      auVar167._20_4_ = auVar124._20_4_ + fStack_6ec;
      auVar167._24_4_ = auVar124._24_4_ + fStack_6e8;
      auVar167._28_4_ = auVar124._28_4_ + fStack_6e4;
      auVar12 = vcmpps_avx(auVar167,auVar142,2);
      auVar226 = ZEXT3264(auVar12);
      auVar168 = vandps_avx(auVar12,*(undefined1 (*) [32])(auStack_180 + lVar103));
      local_5a0 = auVar168;
      auVar12 = *(undefined1 (*) [32])(auStack_180 + lVar103) & auVar12;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') break;
      uVar99 = (ulong)(uVar98 - 1);
    }
    auVar143._8_4_ = 0x7f800000;
    auVar143._0_8_ = 0x7f8000007f800000;
    auVar143._12_4_ = 0x7f800000;
    auVar143._16_4_ = 0x7f800000;
    auVar143._20_4_ = 0x7f800000;
    auVar143._24_4_ = 0x7f800000;
    auVar143._28_4_ = 0x7f800000;
    auVar124 = vblendvps_avx(auVar143,auVar124,auVar168);
    auVar12 = vshufps_avx(auVar124,auVar124,0xb1);
    auVar12 = vminps_avx(auVar124,auVar12);
    auVar128 = vshufpd_avx(auVar12,auVar12,5);
    auVar12 = vminps_avx(auVar12,auVar128);
    auVar128 = vpermpd_avx2(auVar12,0x4e);
    auVar12 = vminps_avx(auVar12,auVar128);
    auVar124 = vcmpps_avx(auVar124,auVar12,0);
    auVar12 = auVar168 & auVar124;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar168 = vandps_avx(auVar124,auVar168);
    }
    uVar102 = vmovmskps_avx(auVar168);
    iVar16 = 0;
    for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x80000000) {
      iVar16 = iVar16 + 1;
    }
    *(undefined4 *)(local_5a0 + (uint)(iVar16 << 2)) = 0;
    uVar100 = (&uStack_140)[uVar99 * 0xc];
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar100;
    local_b44 = aiStack_138[uVar99 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar103) = local_5a0;
    uVar102 = uVar98 - 1;
    if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5a0 >> 0x7f,0) != '\0') ||
          (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5a0 >> 0xbf,0) != '\0') ||
        (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5a0[0x1f] < '\0') {
      uVar102 = uVar98;
    }
    uVar109 = (undefined4)uVar100;
    auVar169._4_4_ = uVar109;
    auVar169._0_4_ = uVar109;
    auVar169._8_4_ = uVar109;
    auVar169._12_4_ = uVar109;
    auVar169._16_4_ = uVar109;
    auVar169._20_4_ = uVar109;
    auVar169._24_4_ = uVar109;
    auVar169._28_4_ = uVar109;
    auVar257 = vmovshdup_avx(auVar121);
    auVar257 = vsubps_avx(auVar257,auVar121);
    auVar144._0_4_ = auVar257._0_4_;
    auVar144._4_4_ = auVar144._0_4_;
    auVar144._8_4_ = auVar144._0_4_;
    auVar144._12_4_ = auVar144._0_4_;
    auVar144._16_4_ = auVar144._0_4_;
    auVar144._20_4_ = auVar144._0_4_;
    auVar144._24_4_ = auVar144._0_4_;
    auVar144._28_4_ = auVar144._0_4_;
    auVar257 = vfmadd132ps_fma(auVar144,auVar169,_DAT_01f7b040);
    _local_5e0 = ZEXT1632(auVar257);
    local_5f0._8_8_ = 0;
    local_5f0._0_8_ = *(ulong *)(local_5e0 + (uint)(iVar16 << 2));
    uVar99 = (ulong)uVar102;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }